

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<8,8>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  int iVar14;
  Geometry *pGVar15;
  __int_type_conflict _Var16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  undefined8 uVar27;
  ulong uVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  byte bVar71;
  ulong uVar72;
  long lVar73;
  Geometry *geometry;
  long lVar74;
  long lVar75;
  bool bVar76;
  ulong uVar77;
  undefined8 unaff_R13;
  ulong uVar78;
  byte bVar79;
  float fVar80;
  float fVar81;
  float fVar131;
  float fVar133;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar85 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar86 [16];
  float fVar132;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar137;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined4 uVar138;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar142;
  undefined8 uVar143;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar151;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar172 [32];
  float fVar173;
  float fVar175;
  undefined1 auVar174 [16];
  uint uVar176;
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  RTCFilterFunctionNArguments args;
  RTCFilterFunctionNArguments local_690;
  undefined1 local_660 [32];
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  LinearSpace3fa *local_550;
  Primitive *local_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  uint local_440;
  uint uStack_43c;
  uint uStack_438;
  uint uStack_434;
  uint uStack_430;
  uint uStack_42c;
  uint uStack_428;
  uint uStack_424;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined4 local_380;
  int local_37c;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  float local_320 [4];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar72 = (ulong)(byte)prim[1];
  lVar73 = uVar72 * 0x25;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar72 * 4 + 6);
  auVar101 = vpmovsxbd_avx2(auVar83);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar72 * 5 + 6);
  auVar98 = vpmovsxbd_avx2(auVar82);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar72 * 6 + 6);
  auVar104 = vpmovsxbd_avx2(auVar84);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar72 * 0xf + 6);
  auVar103 = vpmovsxbd_avx2(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar102 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar72 * 0x11 + 6);
  auVar99 = vpmovsxbd_avx2(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar72 * 0x1a + 6);
  auVar100 = vpmovsxbd_avx2(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar72 * 0x1b + 6);
  auVar93 = vpmovsxbd_avx2(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar72 * 0x1c + 6);
  auVar94 = vpmovsxbd_avx2(auVar12);
  uVar138 = *(undefined4 *)(prim + lVar73 + 0x12);
  auVar85._4_4_ = uVar138;
  auVar85._0_4_ = uVar138;
  auVar85._8_4_ = uVar138;
  auVar85._12_4_ = uVar138;
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar82 = vsubps_avx512vl(auVar83,*(undefined1 (*) [16])(prim + lVar73 + 6));
  fVar142 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar73 + 0x16)) *
            *(float *)(prim + lVar73 + 0x1a);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 7 + 6));
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0xb + 6));
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 9 + 6));
  auVar108 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0xd + 6));
  auVar87 = vpbroadcastd_avx512vl();
  auVar83 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar83 = vinsertps_avx512f(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar82 = vmulps_avx512vl(auVar85,auVar82);
  auVar83 = vmulps_avx512vl(auVar85,auVar83);
  auVar88 = vcvtdq2ps_avx512vl(auVar101);
  auVar89 = vcvtdq2ps_avx512vl(auVar98);
  auVar90 = vcvtdq2ps_avx512vl(auVar104);
  auVar91 = vcvtdq2ps_avx512vl(auVar103);
  auVar92 = vcvtdq2ps_avx512vl(auVar102);
  auVar101 = vcvtdq2ps_avx(auVar99);
  auVar104 = vcvtdq2ps_avx(auVar100);
  auVar103 = vcvtdq2ps_avx(auVar93);
  auVar102 = vcvtdq2ps_avx(auVar94);
  uVar138 = auVar83._0_4_;
  auVar180._4_4_ = uVar138;
  auVar180._0_4_ = uVar138;
  auVar180._8_4_ = uVar138;
  auVar180._12_4_ = uVar138;
  auVar180._16_4_ = uVar138;
  auVar180._20_4_ = uVar138;
  auVar180._24_4_ = uVar138;
  auVar180._28_4_ = uVar138;
  auVar93 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar94 = vpermps_avx512vl(auVar93,ZEXT1632(auVar83));
  auVar95 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar96 = vpermps_avx512vl(auVar95,ZEXT1632(auVar83));
  auVar97 = vmulps_avx512vl(auVar96,auVar90);
  auVar99._4_4_ = auVar96._4_4_ * auVar101._4_4_;
  auVar99._0_4_ = auVar96._0_4_ * auVar101._0_4_;
  auVar99._8_4_ = auVar96._8_4_ * auVar101._8_4_;
  auVar99._12_4_ = auVar96._12_4_ * auVar101._12_4_;
  auVar99._16_4_ = auVar96._16_4_ * auVar101._16_4_;
  auVar99._20_4_ = auVar96._20_4_ * auVar101._20_4_;
  auVar99._24_4_ = auVar96._24_4_ * auVar101._24_4_;
  auVar99._28_4_ = auVar98._28_4_;
  auVar100._4_4_ = auVar102._4_4_ * auVar96._4_4_;
  auVar100._0_4_ = auVar102._0_4_ * auVar96._0_4_;
  auVar100._8_4_ = auVar102._8_4_ * auVar96._8_4_;
  auVar100._12_4_ = auVar102._12_4_ * auVar96._12_4_;
  auVar100._16_4_ = auVar102._16_4_ * auVar96._16_4_;
  auVar100._20_4_ = auVar102._20_4_ * auVar96._20_4_;
  auVar100._24_4_ = auVar102._24_4_ * auVar96._24_4_;
  auVar100._28_4_ = auVar96._28_4_;
  auVar98 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar89);
  auVar99 = vfmadd231ps_avx512vl(auVar99,auVar94,auVar92);
  auVar83 = vfmadd231ps_fma(auVar100,auVar103,auVar94);
  auVar98 = vfmadd231ps_avx512vl(auVar98,auVar180,auVar88);
  auVar99 = vfmadd231ps_avx512vl(auVar99,auVar180,auVar91);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar104,auVar180);
  auVar100 = vbroadcastss_avx512vl(auVar82);
  auVar93 = vpermps_avx512vl(auVar93,ZEXT1632(auVar82));
  auVar94 = vpermps_avx512vl(auVar95,ZEXT1632(auVar82));
  auVar90 = vmulps_avx512vl(auVar94,auVar90);
  auVar101 = vmulps_avx512vl(auVar94,auVar101);
  auVar102 = vmulps_avx512vl(auVar94,auVar102);
  auVar94 = vfmadd231ps_avx512vl(auVar90,auVar93,auVar89);
  auVar101 = vfmadd231ps_avx512vl(auVar101,auVar93,auVar92);
  auVar103 = vfmadd231ps_avx512vl(auVar102,auVar93,auVar103);
  auVar102 = vfmadd231ps_avx512vl(auVar94,auVar100,auVar88);
  auVar88 = vfmadd231ps_avx512vl(auVar101,auVar100,auVar91);
  auVar85 = vfmadd231ps_fma(auVar103,auVar100,auVar104);
  auVar95._8_4_ = 0x7fffffff;
  auVar95._0_8_ = 0x7fffffff7fffffff;
  auVar95._12_4_ = 0x7fffffff;
  auVar95._16_4_ = 0x7fffffff;
  auVar95._20_4_ = 0x7fffffff;
  auVar95._24_4_ = 0x7fffffff;
  auVar95._28_4_ = 0x7fffffff;
  auVar101 = vandps_avx(auVar95,auVar98);
  auVar92._8_4_ = 0x219392ef;
  auVar92._0_8_ = 0x219392ef219392ef;
  auVar92._12_4_ = 0x219392ef;
  auVar92._16_4_ = 0x219392ef;
  auVar92._20_4_ = 0x219392ef;
  auVar92._24_4_ = 0x219392ef;
  auVar92._28_4_ = 0x219392ef;
  uVar78 = vcmpps_avx512vl(auVar101,auVar92,1);
  bVar76 = (bool)((byte)uVar78 & 1);
  auVar89._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar98._0_4_;
  bVar76 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar98._4_4_;
  bVar76 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar98._8_4_;
  bVar76 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar98._12_4_;
  bVar76 = (bool)((byte)(uVar78 >> 4) & 1);
  auVar89._16_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar98._16_4_;
  bVar76 = (bool)((byte)(uVar78 >> 5) & 1);
  auVar89._20_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar98._20_4_;
  bVar76 = (bool)((byte)(uVar78 >> 6) & 1);
  auVar89._24_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar98._24_4_;
  bVar76 = SUB81(uVar78 >> 7,0);
  auVar89._28_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar98._28_4_;
  auVar101 = vandps_avx(auVar95,auVar99);
  uVar78 = vcmpps_avx512vl(auVar101,auVar92,1);
  bVar76 = (bool)((byte)uVar78 & 1);
  auVar90._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar99._0_4_;
  bVar76 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar99._4_4_;
  bVar76 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar99._8_4_;
  bVar76 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar99._12_4_;
  bVar76 = (bool)((byte)(uVar78 >> 4) & 1);
  auVar90._16_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar99._16_4_;
  bVar76 = (bool)((byte)(uVar78 >> 5) & 1);
  auVar90._20_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar99._20_4_;
  bVar76 = (bool)((byte)(uVar78 >> 6) & 1);
  auVar90._24_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar99._24_4_;
  bVar76 = SUB81(uVar78 >> 7,0);
  auVar90._28_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar99._28_4_;
  auVar101 = vandps_avx(auVar95,ZEXT1632(auVar83));
  uVar78 = vcmpps_avx512vl(auVar101,auVar92,1);
  bVar76 = (bool)((byte)uVar78 & 1);
  auVar101._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar83._0_4_;
  bVar76 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar83._4_4_;
  bVar76 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar83._8_4_;
  bVar76 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar83._12_4_;
  auVar101._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar101._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar101._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar101._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar104 = vrcp14ps_avx512vl(auVar89);
  auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar98 = vfnmadd213ps_avx512vl(auVar89,auVar104,auVar103);
  auVar83 = vfmadd132ps_fma(auVar98,auVar104,auVar104);
  auVar104 = vrcp14ps_avx512vl(auVar90);
  auVar98 = vfnmadd213ps_avx512vl(auVar90,auVar104,auVar103);
  auVar82 = vfmadd132ps_fma(auVar98,auVar104,auVar104);
  auVar104 = vrcp14ps_avx512vl(auVar101);
  auVar101 = vfnmadd213ps_avx512vl(auVar101,auVar104,auVar103);
  auVar84 = vfmadd132ps_fma(auVar101,auVar104,auVar104);
  auVar91._4_4_ = fVar142;
  auVar91._0_4_ = fVar142;
  auVar91._8_4_ = fVar142;
  auVar91._12_4_ = fVar142;
  auVar91._16_4_ = fVar142;
  auVar91._20_4_ = fVar142;
  auVar91._24_4_ = fVar142;
  auVar91._28_4_ = fVar142;
  auVar101 = vcvtdq2ps_avx(auVar105);
  auVar104 = vcvtdq2ps_avx(auVar106);
  auVar104 = vsubps_avx(auVar104,auVar101);
  auVar7 = vfmadd213ps_fma(auVar104,auVar91,auVar101);
  auVar101 = vcvtdq2ps_avx(auVar107);
  auVar104 = vcvtdq2ps_avx(auVar108);
  auVar104 = vsubps_avx(auVar104,auVar101);
  auVar8 = vfmadd213ps_fma(auVar104,auVar91,auVar101);
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x12 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x16 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,auVar101);
  auVar9 = vfmadd213ps_fma(auVar104,auVar91,auVar101);
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x14 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x18 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,auVar101);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x1d + 6));
  auVar10 = vfmadd213ps_fma(auVar104,auVar91,auVar101);
  auVar101 = vcvtdq2ps_avx(auVar103);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x21 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,auVar101);
  auVar11 = vfmadd213ps_fma(auVar104,auVar91,auVar101);
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x1f + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x23 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,auVar101);
  auVar12 = vfmadd213ps_fma(auVar104,auVar91,auVar101);
  auVar101 = vsubps_avx(ZEXT1632(auVar7),auVar102);
  auVar93._4_4_ = auVar83._4_4_ * auVar101._4_4_;
  auVar93._0_4_ = auVar83._0_4_ * auVar101._0_4_;
  auVar93._8_4_ = auVar83._8_4_ * auVar101._8_4_;
  auVar93._12_4_ = auVar83._12_4_ * auVar101._12_4_;
  auVar93._16_4_ = auVar101._16_4_ * 0.0;
  auVar93._20_4_ = auVar101._20_4_ * 0.0;
  auVar93._24_4_ = auVar101._24_4_ * 0.0;
  auVar93._28_4_ = auVar101._28_4_;
  auVar101 = vsubps_avx(ZEXT1632(auVar8),auVar102);
  auVar108._0_4_ = auVar83._0_4_ * auVar101._0_4_;
  auVar108._4_4_ = auVar83._4_4_ * auVar101._4_4_;
  auVar108._8_4_ = auVar83._8_4_ * auVar101._8_4_;
  auVar108._12_4_ = auVar83._12_4_ * auVar101._12_4_;
  auVar108._16_4_ = auVar101._16_4_ * 0.0;
  auVar108._20_4_ = auVar101._20_4_ * 0.0;
  auVar108._24_4_ = auVar101._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar101 = vsubps_avx(ZEXT1632(auVar9),auVar88);
  auVar94._4_4_ = auVar82._4_4_ * auVar101._4_4_;
  auVar94._0_4_ = auVar82._0_4_ * auVar101._0_4_;
  auVar94._8_4_ = auVar82._8_4_ * auVar101._8_4_;
  auVar94._12_4_ = auVar82._12_4_ * auVar101._12_4_;
  auVar94._16_4_ = auVar101._16_4_ * 0.0;
  auVar94._20_4_ = auVar101._20_4_ * 0.0;
  auVar94._24_4_ = auVar101._24_4_ * 0.0;
  auVar94._28_4_ = auVar101._28_4_;
  auVar101 = vsubps_avx(ZEXT1632(auVar10),auVar88);
  auVar107._0_4_ = auVar82._0_4_ * auVar101._0_4_;
  auVar107._4_4_ = auVar82._4_4_ * auVar101._4_4_;
  auVar107._8_4_ = auVar82._8_4_ * auVar101._8_4_;
  auVar107._12_4_ = auVar82._12_4_ * auVar101._12_4_;
  auVar107._16_4_ = auVar101._16_4_ * 0.0;
  auVar107._20_4_ = auVar101._20_4_ * 0.0;
  auVar107._24_4_ = auVar101._24_4_ * 0.0;
  auVar107._28_4_ = 0;
  auVar101 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar85));
  auVar105._4_4_ = auVar84._4_4_ * auVar101._4_4_;
  auVar105._0_4_ = auVar84._0_4_ * auVar101._0_4_;
  auVar105._8_4_ = auVar84._8_4_ * auVar101._8_4_;
  auVar105._12_4_ = auVar84._12_4_ * auVar101._12_4_;
  auVar105._16_4_ = auVar101._16_4_ * 0.0;
  auVar105._20_4_ = auVar101._20_4_ * 0.0;
  auVar105._24_4_ = auVar101._24_4_ * 0.0;
  auVar105._28_4_ = auVar101._28_4_;
  auVar101 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar85));
  auVar106._0_4_ = auVar84._0_4_ * auVar101._0_4_;
  auVar106._4_4_ = auVar84._4_4_ * auVar101._4_4_;
  auVar106._8_4_ = auVar84._8_4_ * auVar101._8_4_;
  auVar106._12_4_ = auVar84._12_4_ * auVar101._12_4_;
  auVar106._16_4_ = auVar101._16_4_ * 0.0;
  auVar106._20_4_ = auVar101._20_4_ * 0.0;
  auVar106._24_4_ = auVar101._24_4_ * 0.0;
  auVar106._28_4_ = 0;
  auVar101 = vpminsd_avx2(auVar93,auVar108);
  auVar104 = vpminsd_avx2(auVar94,auVar107);
  auVar101 = vmaxps_avx(auVar101,auVar104);
  auVar104 = vpminsd_avx2(auVar105,auVar106);
  uVar138 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar103._4_4_ = uVar138;
  auVar103._0_4_ = uVar138;
  auVar103._8_4_ = uVar138;
  auVar103._12_4_ = uVar138;
  auVar103._16_4_ = uVar138;
  auVar103._20_4_ = uVar138;
  auVar103._24_4_ = uVar138;
  auVar103._28_4_ = uVar138;
  auVar104 = vmaxps_avx512vl(auVar104,auVar103);
  auVar101 = vmaxps_avx(auVar101,auVar104);
  auVar104._8_4_ = 0x3f7ffffa;
  auVar104._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar104._12_4_ = 0x3f7ffffa;
  auVar104._16_4_ = 0x3f7ffffa;
  auVar104._20_4_ = 0x3f7ffffa;
  auVar104._24_4_ = 0x3f7ffffa;
  auVar104._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar101,auVar104);
  auVar101 = vpmaxsd_avx2(auVar93,auVar108);
  auVar104 = vpmaxsd_avx2(auVar94,auVar107);
  auVar101 = vminps_avx(auVar101,auVar104);
  auVar104 = vpmaxsd_avx2(auVar105,auVar106);
  uVar138 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar102._4_4_ = uVar138;
  auVar102._0_4_ = uVar138;
  auVar102._8_4_ = uVar138;
  auVar102._12_4_ = uVar138;
  auVar102._16_4_ = uVar138;
  auVar102._20_4_ = uVar138;
  auVar102._24_4_ = uVar138;
  auVar102._28_4_ = uVar138;
  auVar104 = vminps_avx512vl(auVar104,auVar102);
  auVar101 = vminps_avx(auVar101,auVar104);
  auVar98._8_4_ = 0x3f800003;
  auVar98._0_8_ = 0x3f8000033f800003;
  auVar98._12_4_ = 0x3f800003;
  auVar98._16_4_ = 0x3f800003;
  auVar98._20_4_ = 0x3f800003;
  auVar98._24_4_ = 0x3f800003;
  auVar98._28_4_ = 0x3f800003;
  auVar101 = vmulps_avx512vl(auVar101,auVar98);
  uVar143 = vcmpps_avx512vl(local_80,auVar101,2);
  uVar27 = vpcmpgtd_avx512vl(auVar87,_DAT_01fb4ba0);
  uVar78 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)(byte)((byte)uVar143 & (byte)uVar27));
  local_550 = pre->ray_space + k;
  local_2c0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_548 = prim;
  for (; uVar78 != 0; uVar78 = (ulong)((uint)uVar78 & (uint)uVar78 + 0xff & (uint)uVar143)) {
    lVar73 = 0;
    for (uVar72 = uVar78; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
      lVar73 = lVar73 + 1;
    }
    uVar13 = *(uint *)(local_548 + 2);
    pGVar15 = (context->scene->geometries).items[uVar13].ptr;
    uVar72 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                             (ulong)*(uint *)(local_548 + lVar73 * 4 + 6) *
                             pGVar15[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    fVar142 = (pGVar15->time_range).lower;
    fVar142 = pGVar15->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar142) / ((pGVar15->time_range).upper - fVar142))
    ;
    auVar83 = vroundss_avx(ZEXT416((uint)fVar142),ZEXT416((uint)fVar142),9);
    auVar83 = vminss_avx(auVar83,ZEXT416((uint)(pGVar15->fnumTimeSegments + -1.0)));
    auVar83 = vmaxss_avx(ZEXT816(0) << 0x20,auVar83);
    fVar142 = fVar142 - auVar83._0_4_;
    _Var16 = pGVar15[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar75 = (long)(int)auVar83._0_4_ * 0x38;
    lVar73 = *(long *)(_Var16 + 0x10 + lVar75);
    lVar74 = *(long *)(_Var16 + 0x38 + lVar75);
    lVar17 = *(long *)(_Var16 + 0x48 + lVar75);
    auVar144._4_4_ = fVar142;
    auVar144._0_4_ = fVar142;
    auVar144._8_4_ = fVar142;
    auVar144._12_4_ = fVar142;
    pfVar4 = (float *)(lVar74 + uVar72 * lVar17);
    auVar181._0_4_ = fVar142 * *pfVar4;
    auVar181._4_4_ = fVar142 * pfVar4[1];
    auVar181._8_4_ = fVar142 * pfVar4[2];
    auVar181._12_4_ = fVar142 * pfVar4[3];
    pfVar4 = (float *)(lVar74 + (uVar72 + 1) * lVar17);
    auVar182._0_4_ = fVar142 * *pfVar4;
    auVar182._4_4_ = fVar142 * pfVar4[1];
    auVar182._8_4_ = fVar142 * pfVar4[2];
    auVar182._12_4_ = fVar142 * pfVar4[3];
    auVar83 = vmulps_avx512vl(auVar144,*(undefined1 (*) [16])(lVar74 + (uVar72 + 2) * lVar17));
    auVar82 = vmulps_avx512vl(auVar144,*(undefined1 (*) [16])(lVar74 + lVar17 * (uVar72 + 3)));
    lVar74 = *(long *)(_Var16 + lVar75);
    fVar142 = 1.0 - fVar142;
    auVar139._4_4_ = fVar142;
    auVar139._0_4_ = fVar142;
    auVar139._8_4_ = fVar142;
    auVar139._12_4_ = fVar142;
    local_610 = vfmadd231ps_fma(auVar181,auVar139,*(undefined1 (*) [16])(lVar74 + lVar73 * uVar72));
    local_620 = vfmadd231ps_fma(auVar182,auVar139,
                                *(undefined1 (*) [16])(lVar74 + lVar73 * (uVar72 + 1)));
    local_630 = vfmadd231ps_avx512vl
                          (auVar83,auVar139,*(undefined1 (*) [16])(lVar74 + lVar73 * (uVar72 + 2)));
    _local_490 = vfmadd231ps_avx512vl
                           (auVar82,auVar139,*(undefined1 (*) [16])(lVar74 + lVar73 * (uVar72 + 3)))
    ;
    iVar14 = (int)pGVar15[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar84 = vsubps_avx(local_610,auVar83);
    uVar138 = auVar84._0_4_;
    auVar148._4_4_ = uVar138;
    auVar148._0_4_ = uVar138;
    auVar148._8_4_ = uVar138;
    auVar148._12_4_ = uVar138;
    auVar82 = vshufps_avx(auVar84,auVar84,0x55);
    auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
    aVar5 = (local_550->vx).field_0;
    aVar6 = (local_550->vy).field_0;
    fVar142 = (local_550->vz).field_0.m128[0];
    fVar151 = *(float *)((long)&(local_550->vz).field_0 + 4);
    fVar173 = *(float *)((long)&(local_550->vz).field_0 + 8);
    fVar175 = *(float *)((long)&(local_550->vz).field_0 + 0xc);
    auVar174._0_4_ = fVar142 * auVar84._0_4_;
    auVar174._4_4_ = fVar151 * auVar84._4_4_;
    auVar174._8_4_ = fVar173 * auVar84._8_4_;
    auVar174._12_4_ = fVar175 * auVar84._12_4_;
    auVar82 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar6,auVar82);
    auVar7 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar5,auVar148);
    auVar84 = vsubps_avx(local_620,auVar83);
    uVar138 = auVar84._0_4_;
    auVar149._4_4_ = uVar138;
    auVar149._0_4_ = uVar138;
    auVar149._8_4_ = uVar138;
    auVar149._12_4_ = uVar138;
    auVar82 = vshufps_avx(auVar84,auVar84,0x55);
    auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar177._0_4_ = fVar142 * auVar84._0_4_;
    auVar177._4_4_ = fVar151 * auVar84._4_4_;
    auVar177._8_4_ = fVar173 * auVar84._8_4_;
    auVar177._12_4_ = fVar175 * auVar84._12_4_;
    auVar82 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar6,auVar82);
    auVar8 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar5,auVar149);
    auVar84 = vsubps_avx512vl(local_630,auVar83);
    uVar138 = auVar84._0_4_;
    auVar150._4_4_ = uVar138;
    auVar150._0_4_ = uVar138;
    auVar150._8_4_ = uVar138;
    auVar150._12_4_ = uVar138;
    auVar82 = vshufps_avx(auVar84,auVar84,0x55);
    auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar179._0_4_ = fVar142 * auVar84._0_4_;
    auVar179._4_4_ = fVar151 * auVar84._4_4_;
    auVar179._8_4_ = fVar173 * auVar84._8_4_;
    auVar179._12_4_ = fVar175 * auVar84._12_4_;
    auVar82 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar6,auVar82);
    auVar9 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar5,auVar150);
    auVar82 = vsubps_avx512vl(_local_490,auVar83);
    uVar138 = auVar82._0_4_;
    auVar86._4_4_ = uVar138;
    auVar86._0_4_ = uVar138;
    auVar86._8_4_ = uVar138;
    auVar86._12_4_ = uVar138;
    auVar83 = vshufps_avx(auVar82,auVar82,0x55);
    auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
    auVar183._0_4_ = fVar142 * auVar82._0_4_;
    auVar183._4_4_ = fVar151 * auVar82._4_4_;
    auVar183._8_4_ = fVar173 * auVar82._8_4_;
    auVar183._12_4_ = fVar175 * auVar82._12_4_;
    auVar83 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar6,auVar83);
    auVar10 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar5,auVar86);
    lVar73 = (long)iVar14 * 0x44;
    auVar101 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar73);
    local_4c0 = vbroadcastss_avx512vl(auVar7);
    auVar87._8_4_ = 1;
    auVar87._0_8_ = 0x100000001;
    auVar87._12_4_ = 1;
    auVar87._16_4_ = 1;
    auVar87._20_4_ = 1;
    auVar87._24_4_ = 1;
    auVar87._28_4_ = 1;
    local_4e0 = vpermps_avx2(auVar87,ZEXT1632(auVar7));
    auVar104 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar73 + 0x484);
    uVar138 = auVar8._0_4_;
    local_500._4_4_ = uVar138;
    local_500._0_4_ = uVar138;
    local_500._8_4_ = uVar138;
    local_500._12_4_ = uVar138;
    local_500._16_4_ = uVar138;
    local_500._20_4_ = uVar138;
    local_500._24_4_ = uVar138;
    local_500._28_4_ = uVar138;
    local_520 = vpermps_avx2(auVar87,ZEXT1632(auVar8));
    auVar103 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar73 + 0x908);
    local_660 = vbroadcastss_avx512vl(auVar9);
    local_600 = vpermps_avx512vl(auVar87,ZEXT1632(auVar9));
    auVar102 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar73 + 0xd8c);
    local_5c0 = vbroadcastss_avx512vl(auVar10);
    auVar193 = ZEXT3264(local_5c0);
    local_5e0 = vpermps_avx512vl(auVar87,ZEXT1632(auVar10));
    auVar194 = ZEXT3264(local_5e0);
    auVar98 = vmulps_avx512vl(local_5c0,auVar102);
    auVar99 = vmulps_avx512vl(local_5e0,auVar102);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar103,local_660);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar103,local_600);
    auVar83 = vfmadd231ps_fma(auVar98,auVar104,local_500);
    auVar82 = vfmadd231ps_fma(auVar99,auVar104,local_520);
    auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar101,local_4c0);
    auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar101,local_4e0);
    auVar98 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar73);
    auVar99 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar73 + 0x484);
    auVar100 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar73 + 0x908);
    auVar93 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar73 + 0xd8c);
    auVar106 = vmulps_avx512vl(local_5c0,auVar93);
    auVar107 = vmulps_avx512vl(local_5e0,auVar93);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar100,local_660);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar100,local_600);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar99,local_500);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar99,local_520);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar98,local_4c0);
    auVar11 = vfmadd231ps_fma(auVar107,auVar98,local_4e0);
    auVar107 = vsubps_avx512vl(auVar106,auVar94);
    auVar108 = vsubps_avx512vl(ZEXT1632(auVar11),auVar105);
    auVar87 = vmulps_avx512vl(auVar105,auVar107);
    auVar88 = vmulps_avx512vl(auVar94,auVar108);
    auVar87 = vsubps_avx512vl(auVar87,auVar88);
    auVar83 = vshufps_avx(local_610,local_610,0xff);
    uVar143 = auVar83._0_8_;
    local_a0._8_8_ = uVar143;
    local_a0._0_8_ = uVar143;
    local_a0._16_8_ = uVar143;
    local_a0._24_8_ = uVar143;
    auVar83 = vshufps_avx(local_620,local_620,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar83);
    auVar83 = vshufps_avx512vl(local_630,local_630,0xff);
    local_e0 = vbroadcastsd_avx512vl(auVar83);
    auVar83 = vshufps_avx512vl(_local_490,_local_490,0xff);
    uVar143 = auVar83._0_8_;
    register0x000012c8 = uVar143;
    local_100 = uVar143;
    register0x000012d0 = uVar143;
    register0x000012d8 = uVar143;
    auVar88 = vmulps_avx512vl(_local_100,auVar102);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar103,local_e0);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar104,local_c0);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar101,local_a0);
    auVar89 = vmulps_avx512vl(_local_100,auVar93);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar100,local_e0);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar99,local_c0);
    auVar12 = vfmadd231ps_fma(auVar89,auVar98,local_a0);
    auVar89 = vmulps_avx512vl(auVar108,auVar108);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar107,auVar107);
    auVar90 = vmaxps_avx512vl(auVar88,ZEXT1632(auVar12));
    auVar90 = vmulps_avx512vl(auVar90,auVar90);
    auVar89 = vmulps_avx512vl(auVar90,auVar89);
    auVar87 = vmulps_avx512vl(auVar87,auVar87);
    uVar143 = vcmpps_avx512vl(auVar87,auVar89,2);
    auVar83 = vblendps_avx(auVar7,local_610,8);
    auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar82 = vandps_avx512vl(auVar83,auVar84);
    auVar83 = vblendps_avx(auVar8,local_620,8);
    auVar83 = vandps_avx512vl(auVar83,auVar84);
    auVar82 = vmaxps_avx(auVar82,auVar83);
    auVar83 = vblendps_avx(auVar9,local_630,8);
    auVar85 = vandps_avx512vl(auVar83,auVar84);
    auVar83 = vblendps_avx(auVar10,_local_490,8);
    auVar83 = vandps_avx512vl(auVar83,auVar84);
    auVar83 = vmaxps_avx(auVar85,auVar83);
    auVar83 = vmaxps_avx(auVar82,auVar83);
    auVar82 = vmovshdup_avx(auVar83);
    auVar82 = vmaxss_avx(auVar82,auVar83);
    auVar83 = vshufpd_avx(auVar83,auVar83,1);
    auVar84 = vcvtsi2ss_avx512f(local_630,iVar14);
    auVar83 = vmaxss_avx(auVar83,auVar82);
    local_400._0_16_ = auVar84;
    fVar151 = auVar84._0_4_;
    auVar97._4_4_ = fVar151;
    auVar97._0_4_ = fVar151;
    auVar97._8_4_ = fVar151;
    auVar97._12_4_ = fVar151;
    auVar97._16_4_ = fVar151;
    auVar97._20_4_ = fVar151;
    auVar97._24_4_ = fVar151;
    auVar97._28_4_ = fVar151;
    uVar27 = vcmpps_avx512vl(auVar97,_DAT_01f7b060,0xe);
    bVar79 = (byte)uVar143 & (byte)uVar27;
    fVar142 = auVar83._0_4_ * 4.7683716e-07;
    auVar96._8_4_ = 2;
    auVar96._0_8_ = 0x200000002;
    auVar96._12_4_ = 2;
    auVar96._16_4_ = 2;
    auVar96._20_4_ = 2;
    auVar96._24_4_ = 2;
    auVar96._28_4_ = 2;
    local_120 = vpermps_avx512vl(auVar96,ZEXT1632(auVar7));
    local_140 = vpermps_avx512vl(auVar96,ZEXT1632(auVar8));
    local_160 = vpermps_avx512vl(auVar96,ZEXT1632(auVar9));
    local_5a0 = vpermps_avx2(auVar96,ZEXT1632(auVar10));
    local_2a0 = vpbroadcastd_avx512vl();
    uVar176 = *(uint *)(ray + k * 4 + 0x60);
    if (bVar79 == 0) {
      bVar76 = false;
      auVar83 = vxorps_avx512vl(auVar93._0_16_,auVar93._0_16_);
      auVar188 = ZEXT1664(auVar83);
      auVar189 = ZEXT3264(local_4c0);
      auVar190 = ZEXT3264(local_4e0);
      auVar191 = ZEXT3264(local_500);
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar195 = ZEXT3264(auVar101);
      auVar187 = ZEXT3264(local_520);
      auVar186 = ZEXT3264(local_660);
      auVar192 = ZEXT3264(local_600);
    }
    else {
      local_540._0_16_ = ZEXT416(uVar176);
      auVar93 = vmulps_avx512vl(local_5a0,auVar93);
      auVar100 = vfmadd213ps_avx512vl(auVar100,local_160,auVar93);
      auVar99 = vfmadd213ps_avx512vl(auVar99,local_140,auVar100);
      auVar99 = vfmadd213ps_avx512vl(auVar98,local_120,auVar99);
      auVar102 = vmulps_avx512vl(local_5a0,auVar102);
      auVar103 = vfmadd213ps_avx512vl(auVar103,local_160,auVar102);
      auVar100 = vfmadd213ps_avx512vl(auVar104,local_140,auVar103);
      auVar104 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar73 + 0x1210);
      auVar103 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar73 + 0x1694);
      auVar102 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar73 + 0x1b18);
      auVar98 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar73 + 0x1f9c);
      auVar100 = vfmadd213ps_avx512vl(auVar101,local_120,auVar100);
      auVar101 = vmulps_avx512vl(local_5c0,auVar98);
      auVar93 = vmulps_avx512vl(local_5e0,auVar98);
      auVar98 = vmulps_avx512vl(local_5a0,auVar98);
      auVar83 = vfmadd231ps_fma(auVar101,auVar102,local_660);
      auVar101 = vfmadd231ps_avx512vl(auVar93,auVar102,local_600);
      auVar102 = vfmadd231ps_avx512vl(auVar98,local_160,auVar102);
      auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,local_500);
      auVar187 = ZEXT3264(local_520);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar103,local_520);
      auVar98 = vfmadd231ps_avx512vl(auVar102,local_140,auVar103);
      auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar104,local_4c0);
      auVar93 = vfmadd231ps_avx512vl(auVar101,auVar104,local_4e0);
      auVar101 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar73 + 0x1210);
      auVar103 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar73 + 0x1b18);
      auVar102 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar73 + 0x1f9c);
      auVar98 = vfmadd231ps_avx512vl(auVar98,local_120,auVar104);
      auVar104 = vmulps_avx512vl(local_5c0,auVar102);
      auVar87 = vmulps_avx512vl(local_5e0,auVar102);
      auVar102 = vmulps_avx512vl(local_5a0,auVar102);
      auVar89 = vfmadd231ps_avx512vl(auVar104,auVar103,local_660);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar103,local_600);
      auVar103 = vfmadd231ps_avx512vl(auVar102,local_160,auVar103);
      auVar104 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar73 + 0x1694);
      auVar102 = vfmadd231ps_avx512vl(auVar89,auVar104,local_500);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar104,local_520);
      auVar104 = vfmadd231ps_avx512vl(auVar103,local_140,auVar104);
      auVar82 = vfmadd231ps_fma(auVar102,auVar101,local_4c0);
      auVar103 = vfmadd231ps_avx512vl(auVar87,auVar101,local_4e0);
      auVar102 = vfmadd231ps_avx512vl(auVar104,local_120,auVar101);
      auVar184._8_4_ = 0x7fffffff;
      auVar184._0_8_ = 0x7fffffff7fffffff;
      auVar184._12_4_ = 0x7fffffff;
      auVar184._16_4_ = 0x7fffffff;
      auVar184._20_4_ = 0x7fffffff;
      auVar184._24_4_ = 0x7fffffff;
      auVar184._28_4_ = 0x7fffffff;
      auVar101 = vandps_avx(ZEXT1632(auVar83),auVar184);
      auVar104 = vandps_avx(auVar93,auVar184);
      auVar104 = vmaxps_avx(auVar101,auVar104);
      auVar101 = vandps_avx(auVar98,auVar184);
      auVar101 = vmaxps_avx(auVar104,auVar101);
      auVar98 = vbroadcastss_avx512vl(ZEXT416((uint)fVar142));
      uVar72 = vcmpps_avx512vl(auVar101,auVar98,1);
      bVar76 = (bool)((byte)uVar72 & 1);
      auVar109._0_4_ = (float)((uint)bVar76 * auVar107._0_4_ | (uint)!bVar76 * auVar83._0_4_);
      bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar109._4_4_ = (float)((uint)bVar76 * auVar107._4_4_ | (uint)!bVar76 * auVar83._4_4_);
      bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar109._8_4_ = (float)((uint)bVar76 * auVar107._8_4_ | (uint)!bVar76 * auVar83._8_4_);
      bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar109._12_4_ = (float)((uint)bVar76 * auVar107._12_4_ | (uint)!bVar76 * auVar83._12_4_);
      fVar175 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar107._16_4_);
      auVar109._16_4_ = fVar175;
      fVar173 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar107._20_4_);
      auVar109._20_4_ = fVar173;
      fVar169 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar107._24_4_);
      auVar109._24_4_ = fVar169;
      uVar1 = (uint)(byte)(uVar72 >> 7) * auVar107._28_4_;
      auVar109._28_4_ = uVar1;
      bVar76 = (bool)((byte)uVar72 & 1);
      auVar110._0_4_ = (float)((uint)bVar76 * auVar108._0_4_ | (uint)!bVar76 * auVar93._0_4_);
      bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar76 * auVar108._4_4_ | (uint)!bVar76 * auVar93._4_4_);
      bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar76 * auVar108._8_4_ | (uint)!bVar76 * auVar93._8_4_);
      bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar76 * auVar108._12_4_ | (uint)!bVar76 * auVar93._12_4_);
      bVar76 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar110._16_4_ = (float)((uint)bVar76 * auVar108._16_4_ | (uint)!bVar76 * auVar93._16_4_);
      bVar76 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar110._20_4_ = (float)((uint)bVar76 * auVar108._20_4_ | (uint)!bVar76 * auVar93._20_4_);
      bVar76 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar110._24_4_ = (float)((uint)bVar76 * auVar108._24_4_ | (uint)!bVar76 * auVar93._24_4_);
      bVar76 = SUB81(uVar72 >> 7,0);
      auVar110._28_4_ = (uint)bVar76 * auVar108._28_4_ | (uint)!bVar76 * auVar93._28_4_;
      auVar101 = vandps_avx(auVar184,ZEXT1632(auVar82));
      auVar104 = vandps_avx(auVar103,auVar184);
      auVar104 = vmaxps_avx(auVar101,auVar104);
      auVar101 = vandps_avx(auVar102,auVar184);
      auVar101 = vmaxps_avx(auVar104,auVar101);
      uVar72 = vcmpps_avx512vl(auVar101,auVar98,1);
      bVar76 = (bool)((byte)uVar72 & 1);
      auVar111._0_4_ = (float)((uint)bVar76 * auVar107._0_4_ | (uint)!bVar76 * auVar82._0_4_);
      bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar76 * auVar107._4_4_ | (uint)!bVar76 * auVar82._4_4_);
      bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar76 * auVar107._8_4_ | (uint)!bVar76 * auVar82._8_4_);
      bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar76 * auVar107._12_4_ | (uint)!bVar76 * auVar82._12_4_);
      fVar171 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar107._16_4_);
      auVar111._16_4_ = fVar171;
      fVar168 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar107._20_4_);
      auVar111._20_4_ = fVar168;
      fVar170 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar107._24_4_);
      auVar111._24_4_ = fVar170;
      auVar111._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar107._28_4_;
      bVar76 = (bool)((byte)uVar72 & 1);
      auVar112._0_4_ = (float)((uint)bVar76 * auVar108._0_4_ | (uint)!bVar76 * auVar103._0_4_);
      bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar112._4_4_ = (float)((uint)bVar76 * auVar108._4_4_ | (uint)!bVar76 * auVar103._4_4_);
      bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar112._8_4_ = (float)((uint)bVar76 * auVar108._8_4_ | (uint)!bVar76 * auVar103._8_4_);
      bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar112._12_4_ = (float)((uint)bVar76 * auVar108._12_4_ | (uint)!bVar76 * auVar103._12_4_);
      bVar76 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar112._16_4_ = (float)((uint)bVar76 * auVar108._16_4_ | (uint)!bVar76 * auVar103._16_4_);
      bVar76 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar112._20_4_ = (float)((uint)bVar76 * auVar108._20_4_ | (uint)!bVar76 * auVar103._20_4_);
      bVar76 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar112._24_4_ = (float)((uint)bVar76 * auVar108._24_4_ | (uint)!bVar76 * auVar103._24_4_);
      bVar76 = SUB81(uVar72 >> 7,0);
      auVar112._28_4_ = (uint)bVar76 * auVar108._28_4_ | (uint)!bVar76 * auVar103._28_4_;
      auVar86 = vxorps_avx512vl(local_660._0_16_,local_660._0_16_);
      auVar188 = ZEXT1664(auVar86);
      auVar101 = vfmadd213ps_avx512vl(auVar109,auVar109,ZEXT1632(auVar86));
      auVar83 = vfmadd231ps_fma(auVar101,auVar110,auVar110);
      auVar101 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
      fVar80 = auVar101._0_4_;
      fVar81 = auVar101._4_4_;
      fVar131 = auVar101._8_4_;
      fVar132 = auVar101._12_4_;
      fVar133 = auVar101._16_4_;
      fVar134 = auVar101._20_4_;
      fVar135 = auVar101._24_4_;
      auVar35._4_4_ = fVar81 * fVar81 * fVar81 * auVar83._4_4_ * -0.5;
      auVar35._0_4_ = fVar80 * fVar80 * fVar80 * auVar83._0_4_ * -0.5;
      auVar35._8_4_ = fVar131 * fVar131 * fVar131 * auVar83._8_4_ * -0.5;
      auVar35._12_4_ = fVar132 * fVar132 * fVar132 * auVar83._12_4_ * -0.5;
      auVar35._16_4_ = fVar133 * fVar133 * fVar133 * -0.0;
      auVar35._20_4_ = fVar134 * fVar134 * fVar134 * -0.0;
      auVar35._24_4_ = fVar135 * fVar135 * fVar135 * -0.0;
      auVar35._28_4_ = 0;
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar103 = vfmadd231ps_avx512vl(auVar35,auVar104,auVar101);
      auVar36._4_4_ = auVar110._4_4_ * auVar103._4_4_;
      auVar36._0_4_ = auVar110._0_4_ * auVar103._0_4_;
      auVar36._8_4_ = auVar110._8_4_ * auVar103._8_4_;
      auVar36._12_4_ = auVar110._12_4_ * auVar103._12_4_;
      auVar36._16_4_ = auVar110._16_4_ * auVar103._16_4_;
      auVar36._20_4_ = auVar110._20_4_ * auVar103._20_4_;
      auVar36._24_4_ = auVar110._24_4_ * auVar103._24_4_;
      auVar36._28_4_ = auVar101._28_4_;
      auVar37._4_4_ = auVar103._4_4_ * -auVar109._4_4_;
      auVar37._0_4_ = auVar103._0_4_ * -auVar109._0_4_;
      auVar37._8_4_ = auVar103._8_4_ * -auVar109._8_4_;
      auVar37._12_4_ = auVar103._12_4_ * -auVar109._12_4_;
      auVar37._16_4_ = auVar103._16_4_ * -fVar175;
      auVar37._20_4_ = auVar103._20_4_ * -fVar173;
      auVar37._24_4_ = auVar103._24_4_ * -fVar169;
      auVar37._28_4_ = uVar1 ^ 0x80000000;
      auVar101 = vmulps_avx512vl(auVar103,ZEXT1632(auVar86));
      auVar107 = ZEXT1632(auVar86);
      auVar102 = vfmadd213ps_avx512vl(auVar111,auVar111,auVar107);
      auVar83 = vfmadd231ps_fma(auVar102,auVar112,auVar112);
      auVar102 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
      fVar173 = auVar102._0_4_;
      fVar175 = auVar102._4_4_;
      fVar169 = auVar102._8_4_;
      fVar80 = auVar102._12_4_;
      fVar81 = auVar102._16_4_;
      fVar131 = auVar102._20_4_;
      fVar132 = auVar102._24_4_;
      auVar38._4_4_ = fVar175 * fVar175 * fVar175 * auVar83._4_4_ * -0.5;
      auVar38._0_4_ = fVar173 * fVar173 * fVar173 * auVar83._0_4_ * -0.5;
      auVar38._8_4_ = fVar169 * fVar169 * fVar169 * auVar83._8_4_ * -0.5;
      auVar38._12_4_ = fVar80 * fVar80 * fVar80 * auVar83._12_4_ * -0.5;
      auVar38._16_4_ = fVar81 * fVar81 * fVar81 * -0.0;
      auVar38._20_4_ = fVar131 * fVar131 * fVar131 * -0.0;
      auVar38._24_4_ = fVar132 * fVar132 * fVar132 * -0.0;
      auVar38._28_4_ = 0;
      auVar104 = vfmadd231ps_avx512vl(auVar38,auVar104,auVar102);
      auVar39._4_4_ = auVar112._4_4_ * auVar104._4_4_;
      auVar39._0_4_ = auVar112._0_4_ * auVar104._0_4_;
      auVar39._8_4_ = auVar112._8_4_ * auVar104._8_4_;
      auVar39._12_4_ = auVar112._12_4_ * auVar104._12_4_;
      auVar39._16_4_ = auVar112._16_4_ * auVar104._16_4_;
      auVar39._20_4_ = auVar112._20_4_ * auVar104._20_4_;
      auVar39._24_4_ = auVar112._24_4_ * auVar104._24_4_;
      auVar39._28_4_ = auVar102._28_4_;
      auVar40._4_4_ = -auVar111._4_4_ * auVar104._4_4_;
      auVar40._0_4_ = -auVar111._0_4_ * auVar104._0_4_;
      auVar40._8_4_ = -auVar111._8_4_ * auVar104._8_4_;
      auVar40._12_4_ = -auVar111._12_4_ * auVar104._12_4_;
      auVar40._16_4_ = -fVar171 * auVar104._16_4_;
      auVar40._20_4_ = -fVar168 * auVar104._20_4_;
      auVar40._24_4_ = -fVar170 * auVar104._24_4_;
      auVar40._28_4_ = auVar103._28_4_;
      auVar104 = vmulps_avx512vl(auVar104,auVar107);
      auVar83 = vfmadd213ps_fma(auVar36,auVar88,auVar94);
      auVar82 = vfmadd213ps_fma(auVar37,auVar88,auVar105);
      auVar103 = vfmadd213ps_avx512vl(auVar101,auVar88,auVar100);
      auVar102 = vfmadd213ps_avx512vl(auVar39,ZEXT1632(auVar12),auVar106);
      auVar10 = vfnmadd213ps_fma(auVar36,auVar88,auVar94);
      auVar93 = ZEXT1632(auVar12);
      auVar84 = vfmadd213ps_fma(auVar40,auVar93,ZEXT1632(auVar11));
      auVar85 = vfnmadd213ps_fma(auVar37,auVar88,auVar105);
      auVar7 = vfmadd213ps_fma(auVar104,auVar93,auVar99);
      auVar98 = vfnmadd231ps_avx512vl(auVar100,auVar88,auVar101);
      auVar139 = vfnmadd213ps_fma(auVar39,auVar93,auVar106);
      auVar11 = vfnmadd213ps_fma(auVar40,auVar93,ZEXT1632(auVar11));
      auVar144 = vfnmadd231ps_fma(auVar99,ZEXT1632(auVar12),auVar104);
      auVar104 = vsubps_avx512vl(auVar102,ZEXT1632(auVar10));
      auVar101 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar85));
      auVar99 = vsubps_avx512vl(ZEXT1632(auVar7),auVar98);
      auVar100 = vmulps_avx512vl(auVar101,auVar98);
      auVar8 = vfmsub231ps_fma(auVar100,ZEXT1632(auVar85),auVar99);
      auVar41._4_4_ = auVar10._4_4_ * auVar99._4_4_;
      auVar41._0_4_ = auVar10._0_4_ * auVar99._0_4_;
      auVar41._8_4_ = auVar10._8_4_ * auVar99._8_4_;
      auVar41._12_4_ = auVar10._12_4_ * auVar99._12_4_;
      auVar41._16_4_ = auVar99._16_4_ * 0.0;
      auVar41._20_4_ = auVar99._20_4_ * 0.0;
      auVar41._24_4_ = auVar99._24_4_ * 0.0;
      auVar41._28_4_ = auVar99._28_4_;
      auVar99 = vfmsub231ps_avx512vl(auVar41,auVar98,auVar104);
      auVar42._4_4_ = auVar85._4_4_ * auVar104._4_4_;
      auVar42._0_4_ = auVar85._0_4_ * auVar104._0_4_;
      auVar42._8_4_ = auVar85._8_4_ * auVar104._8_4_;
      auVar42._12_4_ = auVar85._12_4_ * auVar104._12_4_;
      auVar42._16_4_ = auVar104._16_4_ * 0.0;
      auVar42._20_4_ = auVar104._20_4_ * 0.0;
      auVar42._24_4_ = auVar104._24_4_ * 0.0;
      auVar42._28_4_ = auVar104._28_4_;
      auVar9 = vfmsub231ps_fma(auVar42,ZEXT1632(auVar10),auVar101);
      auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar107,auVar99);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar107,ZEXT1632(auVar8));
      auVar107 = ZEXT1632(auVar86);
      uVar72 = vcmpps_avx512vl(auVar101,auVar107,2);
      bVar71 = (byte)uVar72;
      fVar80 = (float)((uint)(bVar71 & 1) * auVar83._0_4_ |
                      (uint)!(bool)(bVar71 & 1) * auVar139._0_4_);
      bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
      fVar131 = (float)((uint)bVar76 * auVar83._4_4_ | (uint)!bVar76 * auVar139._4_4_);
      bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
      fVar133 = (float)((uint)bVar76 * auVar83._8_4_ | (uint)!bVar76 * auVar139._8_4_);
      bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
      fVar135 = (float)((uint)bVar76 * auVar83._12_4_ | (uint)!bVar76 * auVar139._12_4_);
      auVar100 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar133,CONCAT44(fVar131,fVar80))));
      fVar81 = (float)((uint)(bVar71 & 1) * auVar82._0_4_ |
                      (uint)!(bool)(bVar71 & 1) * auVar11._0_4_);
      bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
      fVar132 = (float)((uint)bVar76 * auVar82._4_4_ | (uint)!bVar76 * auVar11._4_4_);
      bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
      fVar134 = (float)((uint)bVar76 * auVar82._8_4_ | (uint)!bVar76 * auVar11._8_4_);
      bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
      fVar136 = (float)((uint)bVar76 * auVar82._12_4_ | (uint)!bVar76 * auVar11._12_4_);
      auVar93 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar134,CONCAT44(fVar132,fVar81))));
      auVar113._0_4_ =
           (float)((uint)(bVar71 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar144._0_4_)
      ;
      bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar113._4_4_ = (float)((uint)bVar76 * auVar103._4_4_ | (uint)!bVar76 * auVar144._4_4_);
      bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar113._8_4_ = (float)((uint)bVar76 * auVar103._8_4_ | (uint)!bVar76 * auVar144._8_4_);
      bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar113._12_4_ = (float)((uint)bVar76 * auVar103._12_4_ | (uint)!bVar76 * auVar144._12_4_);
      fVar173 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar103._16_4_);
      auVar113._16_4_ = fVar173;
      fVar175 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar103._20_4_);
      auVar113._20_4_ = fVar175;
      fVar169 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar103._24_4_);
      auVar113._24_4_ = fVar169;
      iVar2 = (uint)(byte)(uVar72 >> 7) * auVar103._28_4_;
      auVar113._28_4_ = iVar2;
      auVar104 = vblendmps_avx512vl(ZEXT1632(auVar10),auVar102);
      auVar114._0_4_ =
           (uint)(bVar71 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar82._0_4_;
      bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar114._4_4_ = (uint)bVar76 * auVar104._4_4_ | (uint)!bVar76 * auVar82._4_4_;
      bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar114._8_4_ = (uint)bVar76 * auVar104._8_4_ | (uint)!bVar76 * auVar82._8_4_;
      bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar114._12_4_ = (uint)bVar76 * auVar104._12_4_ | (uint)!bVar76 * auVar82._12_4_;
      auVar114._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar104._16_4_;
      auVar114._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar104._20_4_;
      auVar114._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar104._24_4_;
      auVar114._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar104._28_4_;
      auVar104 = vblendmps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar84));
      auVar115._0_4_ =
           (float)((uint)(bVar71 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar8._0_4_);
      bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar115._4_4_ = (float)((uint)bVar76 * auVar104._4_4_ | (uint)!bVar76 * auVar8._4_4_);
      bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar115._8_4_ = (float)((uint)bVar76 * auVar104._8_4_ | (uint)!bVar76 * auVar8._8_4_);
      bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar115._12_4_ = (float)((uint)bVar76 * auVar104._12_4_ | (uint)!bVar76 * auVar8._12_4_);
      fVar171 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar104._16_4_);
      auVar115._16_4_ = fVar171;
      fVar168 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar104._20_4_);
      auVar115._20_4_ = fVar168;
      fVar170 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar104._24_4_);
      auVar115._24_4_ = fVar170;
      auVar115._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar104._28_4_;
      auVar104 = vblendmps_avx512vl(auVar98,ZEXT1632(auVar7));
      auVar116._0_4_ =
           (float)((uint)(bVar71 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar103._0_4_)
      ;
      bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar116._4_4_ = (float)((uint)bVar76 * auVar104._4_4_ | (uint)!bVar76 * auVar103._4_4_);
      bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar116._8_4_ = (float)((uint)bVar76 * auVar104._8_4_ | (uint)!bVar76 * auVar103._8_4_);
      bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar116._12_4_ = (float)((uint)bVar76 * auVar104._12_4_ | (uint)!bVar76 * auVar103._12_4_);
      bVar76 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar116._16_4_ = (float)((uint)bVar76 * auVar104._16_4_ | (uint)!bVar76 * auVar103._16_4_);
      bVar76 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar116._20_4_ = (float)((uint)bVar76 * auVar104._20_4_ | (uint)!bVar76 * auVar103._20_4_);
      bVar76 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar116._24_4_ = (float)((uint)bVar76 * auVar104._24_4_ | (uint)!bVar76 * auVar103._24_4_);
      bVar76 = SUB81(uVar72 >> 7,0);
      auVar116._28_4_ = (uint)bVar76 * auVar104._28_4_ | (uint)!bVar76 * auVar103._28_4_;
      auVar117._0_4_ =
           (uint)(bVar71 & 1) * (int)auVar10._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar102._0_4_;
      bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar76 * (int)auVar10._4_4_ | (uint)!bVar76 * auVar102._4_4_;
      bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar76 * (int)auVar10._8_4_ | (uint)!bVar76 * auVar102._8_4_;
      bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar76 * (int)auVar10._12_4_ | (uint)!bVar76 * auVar102._12_4_;
      auVar117._16_4_ = (uint)!(bool)((byte)(uVar72 >> 4) & 1) * auVar102._16_4_;
      auVar117._20_4_ = (uint)!(bool)((byte)(uVar72 >> 5) & 1) * auVar102._20_4_;
      auVar117._24_4_ = (uint)!(bool)((byte)(uVar72 >> 6) & 1) * auVar102._24_4_;
      auVar117._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar102._28_4_;
      bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
      bVar20 = (bool)((byte)(uVar72 >> 2) & 1);
      bVar22 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar118._0_4_ = (uint)(bVar71 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar7._0_4_
      ;
      bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar19 * auVar98._4_4_ | (uint)!bVar19 * auVar7._4_4_;
      bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar19 * auVar98._8_4_ | (uint)!bVar19 * auVar7._8_4_;
      bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar19 * auVar98._12_4_ | (uint)!bVar19 * auVar7._12_4_;
      auVar118._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar98._16_4_;
      auVar118._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar98._20_4_;
      auVar118._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar98._24_4_;
      iVar3 = (uint)(byte)(uVar72 >> 7) * auVar98._28_4_;
      auVar118._28_4_ = iVar3;
      auVar94 = vsubps_avx512vl(auVar117,auVar100);
      auVar104 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar85._12_4_ |
                                               (uint)!bVar22 * auVar84._12_4_,
                                               CONCAT48((uint)bVar20 * (int)auVar85._8_4_ |
                                                        (uint)!bVar20 * auVar84._8_4_,
                                                        CONCAT44((uint)bVar76 * (int)auVar85._4_4_ |
                                                                 (uint)!bVar76 * auVar84._4_4_,
                                                                 (uint)(bVar71 & 1) *
                                                                 (int)auVar85._0_4_ |
                                                                 (uint)!(bool)(bVar71 & 1) *
                                                                 auVar84._0_4_)))),auVar93);
      auVar103 = vsubps_avx(auVar118,auVar113);
      auVar102 = vsubps_avx(auVar100,auVar114);
      auVar98 = vsubps_avx(auVar93,auVar115);
      auVar99 = vsubps_avx(auVar113,auVar116);
      auVar43._4_4_ = auVar103._4_4_ * fVar131;
      auVar43._0_4_ = auVar103._0_4_ * fVar80;
      auVar43._8_4_ = auVar103._8_4_ * fVar133;
      auVar43._12_4_ = auVar103._12_4_ * fVar135;
      auVar43._16_4_ = auVar103._16_4_ * 0.0;
      auVar43._20_4_ = auVar103._20_4_ * 0.0;
      auVar43._24_4_ = auVar103._24_4_ * 0.0;
      auVar43._28_4_ = iVar3;
      auVar83 = vfmsub231ps_fma(auVar43,auVar113,auVar94);
      auVar44._4_4_ = fVar132 * auVar94._4_4_;
      auVar44._0_4_ = fVar81 * auVar94._0_4_;
      auVar44._8_4_ = fVar134 * auVar94._8_4_;
      auVar44._12_4_ = fVar136 * auVar94._12_4_;
      auVar44._16_4_ = auVar94._16_4_ * 0.0;
      auVar44._20_4_ = auVar94._20_4_ * 0.0;
      auVar44._24_4_ = auVar94._24_4_ * 0.0;
      auVar44._28_4_ = auVar101._28_4_;
      auVar82 = vfmsub231ps_fma(auVar44,auVar100,auVar104);
      auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar107,ZEXT1632(auVar83));
      auVar158._0_4_ = auVar104._0_4_ * auVar113._0_4_;
      auVar158._4_4_ = auVar104._4_4_ * auVar113._4_4_;
      auVar158._8_4_ = auVar104._8_4_ * auVar113._8_4_;
      auVar158._12_4_ = auVar104._12_4_ * auVar113._12_4_;
      auVar158._16_4_ = auVar104._16_4_ * fVar173;
      auVar158._20_4_ = auVar104._20_4_ * fVar175;
      auVar158._24_4_ = auVar104._24_4_ * fVar169;
      auVar158._28_4_ = 0;
      auVar83 = vfmsub231ps_fma(auVar158,auVar93,auVar103);
      auVar105 = vfmadd231ps_avx512vl(auVar101,auVar107,ZEXT1632(auVar83));
      auVar101 = vmulps_avx512vl(auVar99,auVar114);
      auVar101 = vfmsub231ps_avx512vl(auVar101,auVar102,auVar116);
      auVar45._4_4_ = auVar98._4_4_ * auVar116._4_4_;
      auVar45._0_4_ = auVar98._0_4_ * auVar116._0_4_;
      auVar45._8_4_ = auVar98._8_4_ * auVar116._8_4_;
      auVar45._12_4_ = auVar98._12_4_ * auVar116._12_4_;
      auVar45._16_4_ = auVar98._16_4_ * auVar116._16_4_;
      auVar45._20_4_ = auVar98._20_4_ * auVar116._20_4_;
      auVar45._24_4_ = auVar98._24_4_ * auVar116._24_4_;
      auVar45._28_4_ = auVar116._28_4_;
      auVar83 = vfmsub231ps_fma(auVar45,auVar115,auVar99);
      auVar159._0_4_ = auVar115._0_4_ * auVar102._0_4_;
      auVar159._4_4_ = auVar115._4_4_ * auVar102._4_4_;
      auVar159._8_4_ = auVar115._8_4_ * auVar102._8_4_;
      auVar159._12_4_ = auVar115._12_4_ * auVar102._12_4_;
      auVar159._16_4_ = fVar171 * auVar102._16_4_;
      auVar159._20_4_ = fVar168 * auVar102._20_4_;
      auVar159._24_4_ = fVar170 * auVar102._24_4_;
      auVar159._28_4_ = 0;
      auVar82 = vfmsub231ps_fma(auVar159,auVar98,auVar114);
      auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar107,auVar101);
      auVar106 = vfmadd231ps_avx512vl(auVar101,auVar107,ZEXT1632(auVar83));
      auVar101 = vmaxps_avx(auVar105,auVar106);
      uVar143 = vcmpps_avx512vl(auVar101,auVar107,2);
      bVar79 = bVar79 & (byte)uVar143;
      auVar189 = ZEXT3264(local_4c0);
      auVar190 = ZEXT3264(local_4e0);
      auVar191 = ZEXT3264(local_500);
      auVar186 = ZEXT3264(local_660);
      if (bVar79 == 0) {
        bVar76 = false;
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar195 = ZEXT3264(auVar101);
        auVar192 = ZEXT3264(local_600);
        auVar193 = ZEXT3264(local_5c0);
        auVar194 = ZEXT3264(local_5e0);
      }
      else {
        auVar46._4_4_ = auVar99._4_4_ * auVar104._4_4_;
        auVar46._0_4_ = auVar99._0_4_ * auVar104._0_4_;
        auVar46._8_4_ = auVar99._8_4_ * auVar104._8_4_;
        auVar46._12_4_ = auVar99._12_4_ * auVar104._12_4_;
        auVar46._16_4_ = auVar99._16_4_ * auVar104._16_4_;
        auVar46._20_4_ = auVar99._20_4_ * auVar104._20_4_;
        auVar46._24_4_ = auVar99._24_4_ * auVar104._24_4_;
        auVar46._28_4_ = auVar101._28_4_;
        auVar84 = vfmsub231ps_fma(auVar46,auVar98,auVar103);
        auVar47._4_4_ = auVar103._4_4_ * auVar102._4_4_;
        auVar47._0_4_ = auVar103._0_4_ * auVar102._0_4_;
        auVar47._8_4_ = auVar103._8_4_ * auVar102._8_4_;
        auVar47._12_4_ = auVar103._12_4_ * auVar102._12_4_;
        auVar47._16_4_ = auVar103._16_4_ * auVar102._16_4_;
        auVar47._20_4_ = auVar103._20_4_ * auVar102._20_4_;
        auVar47._24_4_ = auVar103._24_4_ * auVar102._24_4_;
        auVar47._28_4_ = auVar103._28_4_;
        auVar82 = vfmsub231ps_fma(auVar47,auVar94,auVar99);
        auVar48._4_4_ = auVar98._4_4_ * auVar94._4_4_;
        auVar48._0_4_ = auVar98._0_4_ * auVar94._0_4_;
        auVar48._8_4_ = auVar98._8_4_ * auVar94._8_4_;
        auVar48._12_4_ = auVar98._12_4_ * auVar94._12_4_;
        auVar48._16_4_ = auVar98._16_4_ * auVar94._16_4_;
        auVar48._20_4_ = auVar98._20_4_ * auVar94._20_4_;
        auVar48._24_4_ = auVar98._24_4_ * auVar94._24_4_;
        auVar48._28_4_ = auVar98._28_4_;
        auVar7 = vfmsub231ps_fma(auVar48,auVar102,auVar104);
        auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar82),ZEXT1632(auVar7));
        auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar84),auVar107);
        auVar104 = vrcp14ps_avx512vl(auVar101);
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar195 = ZEXT3264(auVar103);
        auVar102 = vfnmadd213ps_avx512vl(auVar104,auVar101,auVar103);
        auVar83 = vfmadd132ps_fma(auVar102,auVar104,auVar104);
        auVar49._4_4_ = auVar7._4_4_ * auVar113._4_4_;
        auVar49._0_4_ = auVar7._0_4_ * auVar113._0_4_;
        auVar49._8_4_ = auVar7._8_4_ * auVar113._8_4_;
        auVar49._12_4_ = auVar7._12_4_ * auVar113._12_4_;
        auVar49._16_4_ = fVar173 * 0.0;
        auVar49._20_4_ = fVar175 * 0.0;
        auVar49._24_4_ = fVar169 * 0.0;
        auVar49._28_4_ = iVar2;
        auVar82 = vfmadd231ps_fma(auVar49,auVar93,ZEXT1632(auVar82));
        auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar100,ZEXT1632(auVar84));
        fVar173 = auVar83._0_4_;
        fVar175 = auVar83._4_4_;
        fVar169 = auVar83._8_4_;
        fVar171 = auVar83._12_4_;
        local_3a0 = ZEXT1632(CONCAT412(auVar82._12_4_ * fVar171,
                                       CONCAT48(auVar82._8_4_ * fVar169,
                                                CONCAT44(auVar82._4_4_ * fVar175,
                                                         auVar82._0_4_ * fVar173))));
        auVar172._4_4_ = uVar176;
        auVar172._0_4_ = uVar176;
        auVar172._8_4_ = uVar176;
        auVar172._12_4_ = uVar176;
        auVar172._16_4_ = uVar176;
        auVar172._20_4_ = uVar176;
        auVar172._24_4_ = uVar176;
        auVar172._28_4_ = uVar176;
        uVar143 = vcmpps_avx512vl(auVar172,local_3a0,2);
        uVar138 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar29._4_4_ = uVar138;
        auVar29._0_4_ = uVar138;
        auVar29._8_4_ = uVar138;
        auVar29._12_4_ = uVar138;
        auVar29._16_4_ = uVar138;
        auVar29._20_4_ = uVar138;
        auVar29._24_4_ = uVar138;
        auVar29._28_4_ = uVar138;
        uVar27 = vcmpps_avx512vl(local_3a0,auVar29,2);
        bVar79 = (byte)uVar143 & (byte)uVar27 & bVar79;
        auVar193 = ZEXT3264(local_5c0);
        auVar194 = ZEXT3264(local_5e0);
        if (bVar79 == 0) {
          bVar76 = false;
          auVar192 = ZEXT3264(local_600);
        }
        else {
          uVar143 = vcmpps_avx512vl(auVar101,auVar107,4);
          bVar79 = bVar79 & (byte)uVar143;
          auVar192 = ZEXT3264(local_600);
          if (bVar79 != 0) {
            fVar168 = auVar105._0_4_ * fVar173;
            fVar170 = auVar105._4_4_ * fVar175;
            auVar50._4_4_ = fVar170;
            auVar50._0_4_ = fVar168;
            fVar80 = auVar105._8_4_ * fVar169;
            auVar50._8_4_ = fVar80;
            fVar81 = auVar105._12_4_ * fVar171;
            auVar50._12_4_ = fVar81;
            fVar131 = auVar105._16_4_ * 0.0;
            auVar50._16_4_ = fVar131;
            fVar132 = auVar105._20_4_ * 0.0;
            auVar50._20_4_ = fVar132;
            fVar133 = auVar105._24_4_ * 0.0;
            auVar50._24_4_ = fVar133;
            auVar50._28_4_ = auVar101._28_4_;
            auVar104 = vsubps_avx512vl(auVar103,auVar50);
            local_3e0._0_4_ =
                 (float)((uint)(bVar71 & 1) * (int)fVar168 |
                        (uint)!(bool)(bVar71 & 1) * auVar104._0_4_);
            bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
            local_3e0._4_4_ = (float)((uint)bVar76 * (int)fVar170 | (uint)!bVar76 * auVar104._4_4_);
            bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
            local_3e0._8_4_ = (float)((uint)bVar76 * (int)fVar80 | (uint)!bVar76 * auVar104._8_4_);
            bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
            local_3e0._12_4_ = (float)((uint)bVar76 * (int)fVar81 | (uint)!bVar76 * auVar104._12_4_)
            ;
            bVar76 = (bool)((byte)(uVar72 >> 4) & 1);
            local_3e0._16_4_ =
                 (float)((uint)bVar76 * (int)fVar131 | (uint)!bVar76 * auVar104._16_4_);
            bVar76 = (bool)((byte)(uVar72 >> 5) & 1);
            local_3e0._20_4_ =
                 (float)((uint)bVar76 * (int)fVar132 | (uint)!bVar76 * auVar104._20_4_);
            bVar76 = (bool)((byte)(uVar72 >> 6) & 1);
            local_3e0._24_4_ =
                 (float)((uint)bVar76 * (int)fVar133 | (uint)!bVar76 * auVar104._24_4_);
            bVar76 = SUB81(uVar72 >> 7,0);
            local_3e0._28_4_ =
                 (float)((uint)bVar76 * auVar101._28_4_ | (uint)!bVar76 * auVar104._28_4_);
            auVar101 = vsubps_avx(ZEXT1632(auVar12),auVar88);
            auVar83 = vfmadd213ps_fma(auVar101,local_3e0,auVar88);
            uVar138 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
            auVar88._4_4_ = uVar138;
            auVar88._0_4_ = uVar138;
            auVar88._8_4_ = uVar138;
            auVar88._12_4_ = uVar138;
            auVar88._16_4_ = uVar138;
            auVar88._20_4_ = uVar138;
            auVar88._24_4_ = uVar138;
            auVar88._28_4_ = uVar138;
            auVar101 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                          CONCAT48(auVar83._8_4_ + auVar83._8_4_,
                                                                   CONCAT44(auVar83._4_4_ +
                                                                            auVar83._4_4_,
                                                                            auVar83._0_4_ +
                                                                            auVar83._0_4_)))),
                                       auVar88);
            uVar143 = vcmpps_avx512vl(local_3a0,auVar101,6);
            if (((byte)uVar143 & bVar79) != 0) {
              auVar156._0_4_ = auVar106._0_4_ * fVar173;
              auVar156._4_4_ = auVar106._4_4_ * fVar175;
              auVar156._8_4_ = auVar106._8_4_ * fVar169;
              auVar156._12_4_ = auVar106._12_4_ * fVar171;
              auVar156._16_4_ = auVar106._16_4_ * 0.0;
              auVar156._20_4_ = auVar106._20_4_ * 0.0;
              auVar156._24_4_ = auVar106._24_4_ * 0.0;
              auVar156._28_4_ = 0;
              auVar101 = vsubps_avx512vl(auVar103,auVar156);
              auVar119._0_4_ =
                   (uint)(bVar71 & 1) * (int)auVar156._0_4_ |
                   (uint)!(bool)(bVar71 & 1) * auVar101._0_4_;
              bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
              auVar119._4_4_ = (uint)bVar76 * (int)auVar156._4_4_ | (uint)!bVar76 * auVar101._4_4_;
              bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
              auVar119._8_4_ = (uint)bVar76 * (int)auVar156._8_4_ | (uint)!bVar76 * auVar101._8_4_;
              bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
              auVar119._12_4_ =
                   (uint)bVar76 * (int)auVar156._12_4_ | (uint)!bVar76 * auVar101._12_4_;
              bVar76 = (bool)((byte)(uVar72 >> 4) & 1);
              auVar119._16_4_ =
                   (uint)bVar76 * (int)auVar156._16_4_ | (uint)!bVar76 * auVar101._16_4_;
              bVar76 = (bool)((byte)(uVar72 >> 5) & 1);
              auVar119._20_4_ =
                   (uint)bVar76 * (int)auVar156._20_4_ | (uint)!bVar76 * auVar101._20_4_;
              bVar76 = (bool)((byte)(uVar72 >> 6) & 1);
              auVar119._24_4_ =
                   (uint)bVar76 * (int)auVar156._24_4_ | (uint)!bVar76 * auVar101._24_4_;
              auVar119._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar101._28_4_;
              auVar30._8_4_ = 0x40000000;
              auVar30._0_8_ = 0x4000000040000000;
              auVar30._12_4_ = 0x40000000;
              auVar30._16_4_ = 0x40000000;
              auVar30._20_4_ = 0x40000000;
              auVar30._24_4_ = 0x40000000;
              auVar30._28_4_ = 0x40000000;
              local_3c0 = vfmsub132ps_avx512vl(auVar119,auVar103,auVar30);
              local_380 = 0;
              local_370 = local_610._0_8_;
              uStack_368 = local_610._8_8_;
              local_360 = local_620._0_8_;
              uStack_358 = local_620._8_8_;
              local_350 = local_630._0_8_;
              uStack_348 = local_630._8_8_;
              if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar76 = true, pGVar15->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_01bb3f6f;
                fVar151 = 1.0 / fVar151;
                local_320[0] = fVar151 * (local_3e0._0_4_ + 0.0);
                local_320[1] = fVar151 * (local_3e0._4_4_ + 1.0);
                local_320[2] = fVar151 * (local_3e0._8_4_ + 2.0);
                local_320[3] = fVar151 * (local_3e0._12_4_ + 3.0);
                fStack_310 = fVar151 * (local_3e0._16_4_ + 4.0);
                fStack_30c = fVar151 * (local_3e0._20_4_ + 5.0);
                fStack_308 = fVar151 * (local_3e0._24_4_ + 6.0);
                fStack_304 = local_3e0._28_4_ + 7.0;
                local_300 = local_3c0;
                local_2e0 = local_3a0;
                uVar72 = 0;
                uVar77 = (ulong)((byte)uVar143 & bVar79);
                for (uVar28 = uVar77; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000)
                {
                  uVar72 = uVar72 + 1;
                }
                local_480 = vpbroadcastd_avx512vl();
                local_37c = iVar14;
                while (auVar83 = auVar188._0_16_, uVar77 != 0) {
                  local_460 = *(float *)(ray + k * 4 + 0x100);
                  fVar151 = local_320[uVar72];
                  auVar145._4_4_ = fVar151;
                  auVar145._0_4_ = fVar151;
                  auVar145._8_4_ = fVar151;
                  auVar145._12_4_ = fVar151;
                  local_220._16_4_ = fVar151;
                  local_220._0_16_ = auVar145;
                  local_220._20_4_ = fVar151;
                  local_220._24_4_ = fVar151;
                  local_220._28_4_ = fVar151;
                  local_200 = *(undefined4 *)(local_300 + uVar72 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar72 * 4);
                  local_690.context = context->user;
                  fVar173 = 1.0 - fVar151;
                  auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar151 * (fVar173 + fVar173))),
                                            ZEXT416((uint)fVar173),ZEXT416((uint)fVar173));
                  auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar145,
                                            ZEXT416(0xc0a00000));
                  auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151 * 3.0)),
                                            ZEXT416((uint)(fVar151 + fVar151)),auVar82);
                  auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar145,
                                            ZEXT416(0x40000000));
                  auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar173 * fVar173 * -3.0)),
                                            ZEXT416((uint)(fVar173 + fVar173)),auVar82);
                  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151)),auVar145,
                                           ZEXT416((uint)(fVar173 * -2.0)));
                  fVar151 = auVar8._0_4_ * 0.5;
                  fVar173 = auVar84._0_4_ * 0.5;
                  fVar175 = auVar82._0_4_ * 0.5;
                  fVar169 = auVar7._0_4_ * 0.5;
                  auVar152._0_4_ = fVar169 * (float)local_490._0_4_;
                  auVar152._4_4_ = fVar169 * (float)local_490._4_4_;
                  auVar152._8_4_ = fVar169 * fStack_488;
                  auVar152._12_4_ = fVar169 * fStack_484;
                  auVar164._4_4_ = fVar175;
                  auVar164._0_4_ = fVar175;
                  auVar164._8_4_ = fVar175;
                  auVar164._12_4_ = fVar175;
                  auVar82 = vfmadd132ps_fma(auVar164,auVar152,local_630);
                  auVar153._4_4_ = fVar173;
                  auVar153._0_4_ = fVar173;
                  auVar153._8_4_ = fVar173;
                  auVar153._12_4_ = fVar173;
                  auVar82 = vfmadd132ps_fma(auVar153,auVar82,local_620);
                  auVar140._4_4_ = fVar151;
                  auVar140._0_4_ = fVar151;
                  auVar140._8_4_ = fVar151;
                  auVar140._12_4_ = fVar151;
                  auVar82 = vfmadd132ps_fma(auVar140,auVar82,local_610);
                  local_280 = auVar82._0_4_;
                  auVar160._8_4_ = 1;
                  auVar160._0_8_ = 0x100000001;
                  auVar160._12_4_ = 1;
                  auVar160._16_4_ = 1;
                  auVar160._20_4_ = 1;
                  auVar160._24_4_ = 1;
                  auVar160._28_4_ = 1;
                  local_260 = vpermps_avx2(auVar160,ZEXT1632(auVar82));
                  auVar166._8_4_ = 2;
                  auVar166._0_8_ = 0x200000002;
                  auVar166._12_4_ = 2;
                  auVar166._16_4_ = 2;
                  auVar166._20_4_ = 2;
                  auVar166._24_4_ = 2;
                  auVar166._28_4_ = 2;
                  local_240 = vpermps_avx2(auVar166,ZEXT1632(auVar82));
                  uStack_27c = local_280;
                  uStack_278 = local_280;
                  uStack_274 = local_280;
                  uStack_270 = local_280;
                  uStack_26c = local_280;
                  uStack_268 = local_280;
                  uStack_264 = local_280;
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  local_1e0 = local_2a0._0_8_;
                  uStack_1d8 = local_2a0._8_8_;
                  uStack_1d0 = local_2a0._16_8_;
                  uStack_1c8 = local_2a0._24_8_;
                  local_1c0 = local_480;
                  vpcmpeqd_avx2(local_480,local_480);
                  local_1a0 = (local_690.context)->instID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_180 = (local_690.context)->instPrimID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_580 = local_2c0;
                  local_690.valid = (int *)local_580;
                  local_690.geometryUserPtr = pGVar15->userPtr;
                  local_690.hit = (RTCHitN *)&local_280;
                  local_690.N = 8;
                  local_420 = (float)uVar77;
                  fStack_41c = (float)(uVar77 >> 0x20);
                  local_440 = (uint)uVar72;
                  uStack_43c = (uint)(uVar72 >> 0x20);
                  local_690.ray = (RTCRayN *)ray;
                  if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar15->occlusionFilterN)(&local_690);
                    uVar72 = CONCAT44(uStack_43c,local_440);
                    uVar77 = CONCAT44(fStack_41c,local_420);
                    auVar194 = ZEXT3264(local_5e0);
                    auVar193 = ZEXT3264(local_5c0);
                    auVar192 = ZEXT3264(local_600);
                    auVar186 = ZEXT3264(local_660);
                    auVar187 = ZEXT3264(local_520);
                    auVar191 = ZEXT3264(local_500);
                    auVar190 = ZEXT3264(local_4e0);
                    auVar189 = ZEXT3264(local_4c0);
                    auVar83 = vxorps_avx512vl(auVar83,auVar83);
                    auVar188 = ZEXT1664(auVar83);
                    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar195 = ZEXT3264(auVar101);
                    uVar176 = local_540._0_4_;
                  }
                  auVar83 = auVar188._0_16_;
                  if (local_580 != (undefined1  [32])0x0) {
                    p_Var18 = context->args->filter;
                    if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var18)(&local_690);
                      uVar72 = CONCAT44(uStack_43c,local_440);
                      uVar77 = CONCAT44(fStack_41c,local_420);
                      auVar194 = ZEXT3264(local_5e0);
                      auVar193 = ZEXT3264(local_5c0);
                      auVar192 = ZEXT3264(local_600);
                      auVar186 = ZEXT3264(local_660);
                      auVar187 = ZEXT3264(local_520);
                      auVar191 = ZEXT3264(local_500);
                      auVar190 = ZEXT3264(local_4e0);
                      auVar189 = ZEXT3264(local_4c0);
                      auVar83 = vxorps_avx512vl(auVar83,auVar83);
                      auVar188 = ZEXT1664(auVar83);
                      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar195 = ZEXT3264(auVar101);
                      uVar176 = local_540._0_4_;
                    }
                    uVar28 = vptestmd_avx512vl(local_580,local_580);
                    auVar101 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar76 = (bool)((byte)uVar28 & 1);
                    auVar120._0_4_ =
                         (uint)bVar76 * auVar101._0_4_ |
                         (uint)!bVar76 * *(int *)(local_690.ray + 0x100);
                    bVar76 = (bool)((byte)(uVar28 >> 1) & 1);
                    auVar120._4_4_ =
                         (uint)bVar76 * auVar101._4_4_ |
                         (uint)!bVar76 * *(int *)(local_690.ray + 0x104);
                    bVar76 = (bool)((byte)(uVar28 >> 2) & 1);
                    auVar120._8_4_ =
                         (uint)bVar76 * auVar101._8_4_ |
                         (uint)!bVar76 * *(int *)(local_690.ray + 0x108);
                    bVar76 = (bool)((byte)(uVar28 >> 3) & 1);
                    auVar120._12_4_ =
                         (uint)bVar76 * auVar101._12_4_ |
                         (uint)!bVar76 * *(int *)(local_690.ray + 0x10c);
                    bVar76 = (bool)((byte)(uVar28 >> 4) & 1);
                    auVar120._16_4_ =
                         (uint)bVar76 * auVar101._16_4_ |
                         (uint)!bVar76 * *(int *)(local_690.ray + 0x110);
                    bVar76 = (bool)((byte)(uVar28 >> 5) & 1);
                    auVar120._20_4_ =
                         (uint)bVar76 * auVar101._20_4_ |
                         (uint)!bVar76 * *(int *)(local_690.ray + 0x114);
                    bVar76 = (bool)((byte)(uVar28 >> 6) & 1);
                    auVar120._24_4_ =
                         (uint)bVar76 * auVar101._24_4_ |
                         (uint)!bVar76 * *(int *)(local_690.ray + 0x118);
                    bVar76 = SUB81(uVar28 >> 7,0);
                    auVar120._28_4_ =
                         (uint)bVar76 * auVar101._28_4_ |
                         (uint)!bVar76 * *(int *)(local_690.ray + 0x11c);
                    *(undefined1 (*) [32])(local_690.ray + 0x100) = auVar120;
                    if (local_580 != (undefined1  [32])0x0) {
                      bVar76 = true;
                      goto LAB_01bb3f6f;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = local_460;
                  uVar28 = uVar72 & 0x3f;
                  uVar72 = 0;
                  uVar77 = uVar77 ^ 1L << uVar28;
                  for (uVar28 = uVar77; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000
                      ) {
                    uVar72 = uVar72 + 1;
                  }
                }
              }
            }
          }
          bVar76 = false;
        }
      }
    }
LAB_01bb3f6f:
    if (8 < iVar14) {
      local_540 = vpbroadcastd_avx512vl();
      local_460 = 1.0 / (float)local_400._0_4_;
      local_400 = vpbroadcastd_avx512vl();
      fStack_45c = local_460;
      fStack_458 = local_460;
      fStack_454 = local_460;
      fStack_450 = local_460;
      fStack_44c = local_460;
      fStack_448 = local_460;
      fStack_444 = local_460;
      local_440 = uVar176;
      uStack_43c = uVar176;
      uStack_438 = uVar176;
      uStack_434 = uVar176;
      uStack_430 = uVar176;
      uStack_42c = uVar176;
      uStack_428 = uVar176;
      uStack_424 = uVar176;
      local_420 = fVar142;
      fStack_41c = fVar142;
      fStack_418 = fVar142;
      fStack_414 = fVar142;
      fStack_410 = fVar142;
      fStack_40c = fVar142;
      fStack_408 = fVar142;
      fStack_404 = fVar142;
      for (lVar74 = 8; lVar74 < iVar14; lVar74 = lVar74 + 8) {
        auVar101 = vpbroadcastd_avx512vl();
        auVar98 = vpor_avx2(auVar101,_DAT_01fb4ba0);
        uVar27 = vpcmpd_avx512vl(auVar98,local_540,1);
        auVar101 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar74 * 4 + lVar73);
        auVar104 = *(undefined1 (*) [32])(lVar73 + 0x22047f0 + lVar74 * 4);
        auVar103 = *(undefined1 (*) [32])(lVar73 + 0x2204c74 + lVar74 * 4);
        auVar102 = *(undefined1 (*) [32])(lVar73 + 0x22050f8 + lVar74 * 4);
        local_5c0 = auVar193._0_32_;
        auVar99 = vmulps_avx512vl(local_5c0,auVar102);
        local_5e0 = auVar194._0_32_;
        auVar100 = vmulps_avx512vl(local_5e0,auVar102);
        auVar51._4_4_ = auVar102._4_4_ * (float)local_100._4_4_;
        auVar51._0_4_ = auVar102._0_4_ * (float)local_100._0_4_;
        auVar51._8_4_ = auVar102._8_4_ * fStack_f8;
        auVar51._12_4_ = auVar102._12_4_ * fStack_f4;
        auVar51._16_4_ = auVar102._16_4_ * fStack_f0;
        auVar51._20_4_ = auVar102._20_4_ * fStack_ec;
        auVar51._24_4_ = auVar102._24_4_ * fStack_e8;
        auVar51._28_4_ = auVar98._28_4_;
        auVar91 = auVar186._0_32_;
        auVar98 = vfmadd231ps_avx512vl(auVar99,auVar103,auVar91);
        local_600 = auVar192._0_32_;
        auVar99 = vfmadd231ps_avx512vl(auVar100,auVar103,local_600);
        auVar100 = vfmadd231ps_avx512vl(auVar51,auVar103,local_e0);
        auVar96 = auVar191._0_32_;
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar104,auVar96);
        auVar92 = auVar187._0_32_;
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar104,auVar92);
        auVar83 = vfmadd231ps_fma(auVar100,auVar104,local_c0);
        local_4c0 = auVar189._0_32_;
        auVar106 = vfmadd231ps_avx512vl(auVar98,auVar101,local_4c0);
        auVar95 = auVar190._0_32_;
        auVar107 = vfmadd231ps_avx512vl(auVar99,auVar101,auVar95);
        auVar98 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar74 * 4 + lVar73);
        auVar99 = *(undefined1 (*) [32])(lVar73 + 0x2206c10 + lVar74 * 4);
        auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar101,local_a0);
        auVar100 = *(undefined1 (*) [32])(lVar73 + 0x2207094 + lVar74 * 4);
        auVar93 = *(undefined1 (*) [32])(lVar73 + 0x2207518 + lVar74 * 4);
        auVar94 = vmulps_avx512vl(local_5c0,auVar93);
        auVar105 = vmulps_avx512vl(local_5e0,auVar93);
        auVar52._4_4_ = auVar93._4_4_ * (float)local_100._4_4_;
        auVar52._0_4_ = auVar93._0_4_ * (float)local_100._0_4_;
        auVar52._8_4_ = auVar93._8_4_ * fStack_f8;
        auVar52._12_4_ = auVar93._12_4_ * fStack_f4;
        auVar52._16_4_ = auVar93._16_4_ * fStack_f0;
        auVar52._20_4_ = auVar93._20_4_ * fStack_ec;
        auVar52._24_4_ = auVar93._24_4_ * fStack_e8;
        auVar52._28_4_ = uStack_e4;
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,auVar91);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar100,local_600);
        auVar108 = vfmadd231ps_avx512vl(auVar52,auVar100,local_e0);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar99,auVar96);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar99,auVar92);
        auVar82 = vfmadd231ps_fma(auVar108,auVar99,local_c0);
        auVar108 = vfmadd231ps_avx512vl(auVar94,auVar98,local_4c0);
        auVar87 = vfmadd231ps_avx512vl(auVar105,auVar98,auVar95);
        auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar98,local_a0);
        auVar88 = vmaxps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar82));
        auVar94 = vsubps_avx(auVar108,auVar106);
        auVar105 = vsubps_avx(auVar87,auVar107);
        auVar89 = vmulps_avx512vl(auVar107,auVar94);
        auVar90 = vmulps_avx512vl(auVar106,auVar105);
        auVar89 = vsubps_avx512vl(auVar89,auVar90);
        auVar90 = vmulps_avx512vl(auVar105,auVar105);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar94,auVar94);
        auVar88 = vmulps_avx512vl(auVar88,auVar88);
        auVar88 = vmulps_avx512vl(auVar88,auVar90);
        auVar89 = vmulps_avx512vl(auVar89,auVar89);
        uVar143 = vcmpps_avx512vl(auVar89,auVar88,2);
        bVar79 = (byte)uVar27 & (byte)uVar143;
        if (bVar79 == 0) {
          auVar187 = ZEXT3264(auVar92);
          auVar186 = ZEXT3264(auVar91);
        }
        else {
          auVar93 = vmulps_avx512vl(local_5a0,auVar93);
          auVar100 = vfmadd213ps_avx512vl(auVar100,local_160,auVar93);
          auVar99 = vfmadd213ps_avx512vl(auVar99,local_140,auVar100);
          auVar98 = vfmadd213ps_avx512vl(auVar98,local_120,auVar99);
          auVar102 = vmulps_avx512vl(local_5a0,auVar102);
          auVar103 = vfmadd213ps_avx512vl(auVar103,local_160,auVar102);
          auVar104 = vfmadd213ps_avx512vl(auVar104,local_140,auVar103);
          auVar99 = vfmadd213ps_avx512vl(auVar101,local_120,auVar104);
          auVar101 = *(undefined1 (*) [32])(lVar73 + 0x220557c + lVar74 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar73 + 0x2205a00 + lVar74 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar73 + 0x2205e84 + lVar74 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar73 + 0x2206308 + lVar74 * 4);
          auVar100 = vmulps_avx512vl(local_5c0,auVar102);
          auVar93 = vmulps_avx512vl(local_5e0,auVar102);
          auVar102 = vmulps_avx512vl(local_5a0,auVar102);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar103,auVar91);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar103,local_600);
          auVar103 = vfmadd231ps_avx512vl(auVar102,local_160,auVar103);
          auVar102 = vfmadd231ps_avx512vl(auVar100,auVar104,auVar96);
          auVar100 = vfmadd231ps_avx512vl(auVar93,auVar104,auVar92);
          auVar104 = vfmadd231ps_avx512vl(auVar103,local_140,auVar104);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar101,local_4c0);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar101,auVar95);
          auVar93 = vfmadd231ps_avx512vl(auVar104,local_120,auVar101);
          auVar101 = *(undefined1 (*) [32])(lVar73 + 0x220799c + lVar74 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar73 + 0x22082a4 + lVar74 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar73 + 0x2208728 + lVar74 * 4);
          auVar88 = vmulps_avx512vl(local_5c0,auVar103);
          auVar89 = vmulps_avx512vl(local_5e0,auVar103);
          auVar103 = vmulps_avx512vl(local_5a0,auVar103);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar104,auVar91);
          auVar89 = vfmadd231ps_avx512vl(auVar89,auVar104,local_600);
          auVar103 = vfmadd231ps_avx512vl(auVar103,local_160,auVar104);
          auVar104 = *(undefined1 (*) [32])(lVar73 + 0x2207e20 + lVar74 * 4);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar104,auVar96);
          auVar89 = vfmadd231ps_avx512vl(auVar89,auVar104,auVar92);
          auVar104 = vfmadd231ps_avx512vl(auVar103,local_140,auVar104);
          auVar103 = vfmadd231ps_avx512vl(auVar88,auVar101,local_4c0);
          auVar88 = vfmadd231ps_avx512vl(auVar89,auVar101,auVar95);
          auVar104 = vfmadd231ps_avx512vl(auVar104,local_120,auVar101);
          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar102,auVar89);
          vandps_avx512vl(auVar100,auVar89);
          auVar101 = vmaxps_avx(auVar89,auVar89);
          vandps_avx512vl(auVar93,auVar89);
          auVar101 = vmaxps_avx(auVar101,auVar89);
          auVar70._4_4_ = fStack_41c;
          auVar70._0_4_ = local_420;
          auVar70._8_4_ = fStack_418;
          auVar70._12_4_ = fStack_414;
          auVar70._16_4_ = fStack_410;
          auVar70._20_4_ = fStack_40c;
          auVar70._24_4_ = fStack_408;
          auVar70._28_4_ = fStack_404;
          uVar72 = vcmpps_avx512vl(auVar101,auVar70,1);
          bVar19 = (bool)((byte)uVar72 & 1);
          auVar121._0_4_ = (float)((uint)bVar19 * auVar94._0_4_ | (uint)!bVar19 * auVar102._0_4_);
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar19 * auVar94._4_4_ | (uint)!bVar19 * auVar102._4_4_);
          bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar19 * auVar94._8_4_ | (uint)!bVar19 * auVar102._8_4_);
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar19 * auVar94._12_4_ | (uint)!bVar19 * auVar102._12_4_)
          ;
          bVar19 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar121._16_4_ = (float)((uint)bVar19 * auVar94._16_4_ | (uint)!bVar19 * auVar102._16_4_)
          ;
          bVar19 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar121._20_4_ = (float)((uint)bVar19 * auVar94._20_4_ | (uint)!bVar19 * auVar102._20_4_)
          ;
          bVar19 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar121._24_4_ = (float)((uint)bVar19 * auVar94._24_4_ | (uint)!bVar19 * auVar102._24_4_)
          ;
          bVar19 = SUB81(uVar72 >> 7,0);
          auVar121._28_4_ = (uint)bVar19 * auVar94._28_4_ | (uint)!bVar19 * auVar102._28_4_;
          bVar19 = (bool)((byte)uVar72 & 1);
          auVar122._0_4_ = (float)((uint)bVar19 * auVar105._0_4_ | (uint)!bVar19 * auVar100._0_4_);
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar19 * auVar105._4_4_ | (uint)!bVar19 * auVar100._4_4_);
          bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar19 * auVar105._8_4_ | (uint)!bVar19 * auVar100._8_4_);
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar122._12_4_ =
               (float)((uint)bVar19 * auVar105._12_4_ | (uint)!bVar19 * auVar100._12_4_);
          bVar19 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar122._16_4_ =
               (float)((uint)bVar19 * auVar105._16_4_ | (uint)!bVar19 * auVar100._16_4_);
          bVar19 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar122._20_4_ =
               (float)((uint)bVar19 * auVar105._20_4_ | (uint)!bVar19 * auVar100._20_4_);
          bVar19 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar122._24_4_ =
               (float)((uint)bVar19 * auVar105._24_4_ | (uint)!bVar19 * auVar100._24_4_);
          bVar19 = SUB81(uVar72 >> 7,0);
          auVar122._28_4_ = (uint)bVar19 * auVar105._28_4_ | (uint)!bVar19 * auVar100._28_4_;
          vandps_avx512vl(auVar103,auVar89);
          vandps_avx512vl(auVar88,auVar89);
          auVar101 = vmaxps_avx(auVar122,auVar122);
          vandps_avx512vl(auVar104,auVar89);
          auVar101 = vmaxps_avx(auVar101,auVar122);
          uVar72 = vcmpps_avx512vl(auVar101,auVar70,1);
          bVar19 = (bool)((byte)uVar72 & 1);
          auVar123._0_4_ = (uint)bVar19 * auVar94._0_4_ | (uint)!bVar19 * auVar103._0_4_;
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar123._4_4_ = (uint)bVar19 * auVar94._4_4_ | (uint)!bVar19 * auVar103._4_4_;
          bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar123._8_4_ = (uint)bVar19 * auVar94._8_4_ | (uint)!bVar19 * auVar103._8_4_;
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar123._12_4_ = (uint)bVar19 * auVar94._12_4_ | (uint)!bVar19 * auVar103._12_4_;
          bVar19 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar123._16_4_ = (uint)bVar19 * auVar94._16_4_ | (uint)!bVar19 * auVar103._16_4_;
          bVar19 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar123._20_4_ = (uint)bVar19 * auVar94._20_4_ | (uint)!bVar19 * auVar103._20_4_;
          bVar19 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar123._24_4_ = (uint)bVar19 * auVar94._24_4_ | (uint)!bVar19 * auVar103._24_4_;
          bVar19 = SUB81(uVar72 >> 7,0);
          auVar123._28_4_ = (uint)bVar19 * auVar94._28_4_ | (uint)!bVar19 * auVar103._28_4_;
          bVar19 = (bool)((byte)uVar72 & 1);
          auVar124._0_4_ = (float)((uint)bVar19 * auVar105._0_4_ | (uint)!bVar19 * auVar88._0_4_);
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar19 * auVar105._4_4_ | (uint)!bVar19 * auVar88._4_4_);
          bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar19 * auVar105._8_4_ | (uint)!bVar19 * auVar88._8_4_);
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar124._12_4_ = (float)((uint)bVar19 * auVar105._12_4_ | (uint)!bVar19 * auVar88._12_4_)
          ;
          bVar19 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar124._16_4_ = (float)((uint)bVar19 * auVar105._16_4_ | (uint)!bVar19 * auVar88._16_4_)
          ;
          bVar19 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar124._20_4_ = (float)((uint)bVar19 * auVar105._20_4_ | (uint)!bVar19 * auVar88._20_4_)
          ;
          bVar19 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar124._24_4_ = (float)((uint)bVar19 * auVar105._24_4_ | (uint)!bVar19 * auVar88._24_4_)
          ;
          bVar19 = SUB81(uVar72 >> 7,0);
          auVar124._28_4_ = (uint)bVar19 * auVar105._28_4_ | (uint)!bVar19 * auVar88._28_4_;
          auVar178._8_4_ = 0x80000000;
          auVar178._0_8_ = 0x8000000080000000;
          auVar178._12_4_ = 0x80000000;
          auVar178._16_4_ = 0x80000000;
          auVar178._20_4_ = 0x80000000;
          auVar178._24_4_ = 0x80000000;
          auVar178._28_4_ = 0x80000000;
          auVar101 = vxorps_avx512vl(auVar123,auVar178);
          auVar88 = auVar188._0_32_;
          auVar104 = vfmadd213ps_avx512vl(auVar121,auVar121,auVar88);
          auVar84 = vfmadd231ps_fma(auVar104,auVar122,auVar122);
          auVar104 = vrsqrt14ps_avx512vl(ZEXT1632(auVar84));
          auVar185._8_4_ = 0xbf000000;
          auVar185._0_8_ = 0xbf000000bf000000;
          auVar185._12_4_ = 0xbf000000;
          auVar185._16_4_ = 0xbf000000;
          auVar185._20_4_ = 0xbf000000;
          auVar185._24_4_ = 0xbf000000;
          auVar185._28_4_ = 0xbf000000;
          fVar142 = auVar104._0_4_;
          fVar151 = auVar104._4_4_;
          fVar173 = auVar104._8_4_;
          fVar175 = auVar104._12_4_;
          fVar169 = auVar104._16_4_;
          fVar171 = auVar104._20_4_;
          fVar168 = auVar104._24_4_;
          auVar53._4_4_ = fVar151 * fVar151 * fVar151 * auVar84._4_4_ * -0.5;
          auVar53._0_4_ = fVar142 * fVar142 * fVar142 * auVar84._0_4_ * -0.5;
          auVar53._8_4_ = fVar173 * fVar173 * fVar173 * auVar84._8_4_ * -0.5;
          auVar53._12_4_ = fVar175 * fVar175 * fVar175 * auVar84._12_4_ * -0.5;
          auVar53._16_4_ = fVar169 * fVar169 * fVar169 * -0.0;
          auVar53._20_4_ = fVar171 * fVar171 * fVar171 * -0.0;
          auVar53._24_4_ = fVar168 * fVar168 * fVar168 * -0.0;
          auVar53._28_4_ = auVar122._28_4_;
          auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar104 = vfmadd231ps_avx512vl(auVar53,auVar103,auVar104);
          auVar54._4_4_ = auVar122._4_4_ * auVar104._4_4_;
          auVar54._0_4_ = auVar122._0_4_ * auVar104._0_4_;
          auVar54._8_4_ = auVar122._8_4_ * auVar104._8_4_;
          auVar54._12_4_ = auVar122._12_4_ * auVar104._12_4_;
          auVar54._16_4_ = auVar122._16_4_ * auVar104._16_4_;
          auVar54._20_4_ = auVar122._20_4_ * auVar104._20_4_;
          auVar54._24_4_ = auVar122._24_4_ * auVar104._24_4_;
          auVar54._28_4_ = 0;
          auVar55._4_4_ = auVar104._4_4_ * -auVar121._4_4_;
          auVar55._0_4_ = auVar104._0_4_ * -auVar121._0_4_;
          auVar55._8_4_ = auVar104._8_4_ * -auVar121._8_4_;
          auVar55._12_4_ = auVar104._12_4_ * -auVar121._12_4_;
          auVar55._16_4_ = auVar104._16_4_ * -auVar121._16_4_;
          auVar55._20_4_ = auVar104._20_4_ * -auVar121._20_4_;
          auVar55._24_4_ = auVar104._24_4_ * -auVar121._24_4_;
          auVar55._28_4_ = auVar122._28_4_;
          auVar102 = vmulps_avx512vl(auVar104,auVar88);
          auVar104 = vfmadd213ps_avx512vl(auVar123,auVar123,auVar88);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar124,auVar124);
          auVar100 = vrsqrt14ps_avx512vl(auVar104);
          auVar104 = vmulps_avx512vl(auVar104,auVar185);
          fVar142 = auVar100._0_4_;
          fVar151 = auVar100._4_4_;
          fVar173 = auVar100._8_4_;
          fVar175 = auVar100._12_4_;
          fVar169 = auVar100._16_4_;
          fVar171 = auVar100._20_4_;
          fVar168 = auVar100._24_4_;
          auVar56._4_4_ = fVar151 * fVar151 * fVar151 * auVar104._4_4_;
          auVar56._0_4_ = fVar142 * fVar142 * fVar142 * auVar104._0_4_;
          auVar56._8_4_ = fVar173 * fVar173 * fVar173 * auVar104._8_4_;
          auVar56._12_4_ = fVar175 * fVar175 * fVar175 * auVar104._12_4_;
          auVar56._16_4_ = fVar169 * fVar169 * fVar169 * auVar104._16_4_;
          auVar56._20_4_ = fVar171 * fVar171 * fVar171 * auVar104._20_4_;
          auVar56._24_4_ = fVar168 * fVar168 * fVar168 * auVar104._24_4_;
          auVar56._28_4_ = auVar104._28_4_;
          auVar104 = vfmadd231ps_avx512vl(auVar56,auVar103,auVar100);
          auVar57._4_4_ = auVar124._4_4_ * auVar104._4_4_;
          auVar57._0_4_ = auVar124._0_4_ * auVar104._0_4_;
          auVar57._8_4_ = auVar124._8_4_ * auVar104._8_4_;
          auVar57._12_4_ = auVar124._12_4_ * auVar104._12_4_;
          auVar57._16_4_ = auVar124._16_4_ * auVar104._16_4_;
          auVar57._20_4_ = auVar124._20_4_ * auVar104._20_4_;
          auVar57._24_4_ = auVar124._24_4_ * auVar104._24_4_;
          auVar57._28_4_ = auVar100._28_4_;
          auVar58._4_4_ = auVar104._4_4_ * auVar101._4_4_;
          auVar58._0_4_ = auVar104._0_4_ * auVar101._0_4_;
          auVar58._8_4_ = auVar104._8_4_ * auVar101._8_4_;
          auVar58._12_4_ = auVar104._12_4_ * auVar101._12_4_;
          auVar58._16_4_ = auVar104._16_4_ * auVar101._16_4_;
          auVar58._20_4_ = auVar104._20_4_ * auVar101._20_4_;
          auVar58._24_4_ = auVar104._24_4_ * auVar101._24_4_;
          auVar58._28_4_ = auVar101._28_4_;
          auVar101 = vmulps_avx512vl(auVar104,auVar88);
          auVar84 = vfmadd213ps_fma(auVar54,ZEXT1632(auVar83),auVar106);
          auVar104 = ZEXT1632(auVar83);
          auVar7 = vfmadd213ps_fma(auVar55,auVar104,auVar107);
          auVar103 = vfmadd213ps_avx512vl(auVar102,auVar104,auVar99);
          auVar100 = vfmadd213ps_avx512vl(auVar57,ZEXT1632(auVar82),auVar108);
          auVar12 = vfnmadd213ps_fma(auVar54,auVar104,auVar106);
          auVar93 = ZEXT1632(auVar82);
          auVar8 = vfmadd213ps_fma(auVar58,auVar93,auVar87);
          auVar85 = vfnmadd213ps_fma(auVar55,auVar104,auVar107);
          auVar9 = vfmadd213ps_fma(auVar101,auVar93,auVar98);
          auVar107 = ZEXT1632(auVar83);
          auVar86 = vfnmadd231ps_fma(auVar99,auVar107,auVar102);
          auVar139 = vfnmadd213ps_fma(auVar57,auVar93,auVar108);
          auVar144 = vfnmadd213ps_fma(auVar58,auVar93,auVar87);
          auVar148 = vfnmadd231ps_fma(auVar98,ZEXT1632(auVar82),auVar101);
          auVar98 = vsubps_avx512vl(auVar100,ZEXT1632(auVar12));
          auVar101 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar85));
          auVar104 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar86));
          auVar59._4_4_ = auVar101._4_4_ * auVar86._4_4_;
          auVar59._0_4_ = auVar101._0_4_ * auVar86._0_4_;
          auVar59._8_4_ = auVar101._8_4_ * auVar86._8_4_;
          auVar59._12_4_ = auVar101._12_4_ * auVar86._12_4_;
          auVar59._16_4_ = auVar101._16_4_ * 0.0;
          auVar59._20_4_ = auVar101._20_4_ * 0.0;
          auVar59._24_4_ = auVar101._24_4_ * 0.0;
          auVar59._28_4_ = auVar102._28_4_;
          auVar83 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar85),auVar104);
          auVar60._4_4_ = auVar104._4_4_ * auVar12._4_4_;
          auVar60._0_4_ = auVar104._0_4_ * auVar12._0_4_;
          auVar60._8_4_ = auVar104._8_4_ * auVar12._8_4_;
          auVar60._12_4_ = auVar104._12_4_ * auVar12._12_4_;
          auVar60._16_4_ = auVar104._16_4_ * 0.0;
          auVar60._20_4_ = auVar104._20_4_ * 0.0;
          auVar60._24_4_ = auVar104._24_4_ * 0.0;
          auVar60._28_4_ = auVar104._28_4_;
          auVar10 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar86),auVar98);
          auVar61._4_4_ = auVar85._4_4_ * auVar98._4_4_;
          auVar61._0_4_ = auVar85._0_4_ * auVar98._0_4_;
          auVar61._8_4_ = auVar85._8_4_ * auVar98._8_4_;
          auVar61._12_4_ = auVar85._12_4_ * auVar98._12_4_;
          auVar61._16_4_ = auVar98._16_4_ * 0.0;
          auVar61._20_4_ = auVar98._20_4_ * 0.0;
          auVar61._24_4_ = auVar98._24_4_ * 0.0;
          auVar61._28_4_ = auVar98._28_4_;
          auVar11 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar12),auVar101);
          auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar11),auVar88,ZEXT1632(auVar10));
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar88,ZEXT1632(auVar83));
          uVar72 = vcmpps_avx512vl(auVar101,auVar88,2);
          bVar71 = (byte)uVar72;
          fVar81 = (float)((uint)(bVar71 & 1) * auVar84._0_4_ |
                          (uint)!(bool)(bVar71 & 1) * auVar139._0_4_);
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          fVar132 = (float)((uint)bVar19 * auVar84._4_4_ | (uint)!bVar19 * auVar139._4_4_);
          bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
          fVar134 = (float)((uint)bVar19 * auVar84._8_4_ | (uint)!bVar19 * auVar139._8_4_);
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          fVar136 = (float)((uint)bVar19 * auVar84._12_4_ | (uint)!bVar19 * auVar139._12_4_);
          auVar93 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar134,CONCAT44(fVar132,fVar81))));
          fVar131 = (float)((uint)(bVar71 & 1) * auVar7._0_4_ |
                           (uint)!(bool)(bVar71 & 1) * auVar144._0_4_);
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          fVar133 = (float)((uint)bVar19 * auVar7._4_4_ | (uint)!bVar19 * auVar144._4_4_);
          bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
          fVar135 = (float)((uint)bVar19 * auVar7._8_4_ | (uint)!bVar19 * auVar144._8_4_);
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          fVar137 = (float)((uint)bVar19 * auVar7._12_4_ | (uint)!bVar19 * auVar144._12_4_);
          auVar94 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar135,CONCAT44(fVar133,fVar131))));
          auVar125._0_4_ =
               (float)((uint)(bVar71 & 1) * auVar103._0_4_ |
                      (uint)!(bool)(bVar71 & 1) * auVar148._0_4_);
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar19 * auVar103._4_4_ | (uint)!bVar19 * auVar148._4_4_);
          bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar19 * auVar103._8_4_ | (uint)!bVar19 * auVar148._8_4_);
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar125._12_4_ =
               (float)((uint)bVar19 * auVar103._12_4_ | (uint)!bVar19 * auVar148._12_4_);
          fVar173 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar103._16_4_);
          auVar125._16_4_ = fVar173;
          fVar151 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar103._20_4_);
          auVar125._20_4_ = fVar151;
          fVar142 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar103._24_4_);
          auVar125._24_4_ = fVar142;
          iVar2 = (uint)(byte)(uVar72 >> 7) * auVar103._28_4_;
          auVar125._28_4_ = iVar2;
          auVar101 = vblendmps_avx512vl(ZEXT1632(auVar12),auVar100);
          auVar126._0_4_ =
               (uint)(bVar71 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar83._0_4_;
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar19 * auVar101._4_4_ | (uint)!bVar19 * auVar83._4_4_;
          bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar19 * auVar101._8_4_ | (uint)!bVar19 * auVar83._8_4_;
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar19 * auVar101._12_4_ | (uint)!bVar19 * auVar83._12_4_;
          auVar126._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar101._16_4_;
          auVar126._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar101._20_4_;
          auVar126._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar101._24_4_;
          auVar126._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar101._28_4_;
          auVar101 = vblendmps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar8));
          auVar127._0_4_ =
               (float)((uint)(bVar71 & 1) * auVar101._0_4_ |
                      (uint)!(bool)(bVar71 & 1) * auVar84._0_4_);
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar19 * auVar101._4_4_ | (uint)!bVar19 * auVar84._4_4_);
          bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar19 * auVar101._8_4_ | (uint)!bVar19 * auVar84._8_4_);
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar127._12_4_ = (float)((uint)bVar19 * auVar101._12_4_ | (uint)!bVar19 * auVar84._12_4_)
          ;
          fVar169 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar101._16_4_);
          auVar127._16_4_ = fVar169;
          fVar175 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar101._20_4_);
          auVar127._20_4_ = fVar175;
          fVar171 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar101._24_4_);
          auVar127._24_4_ = fVar171;
          auVar127._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar101._28_4_;
          auVar101 = vblendmps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar9));
          auVar128._0_4_ =
               (float)((uint)(bVar71 & 1) * auVar101._0_4_ |
                      (uint)!(bool)(bVar71 & 1) * auVar7._0_4_);
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar19 * auVar101._4_4_ | (uint)!bVar19 * auVar7._4_4_);
          bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar19 * auVar101._8_4_ | (uint)!bVar19 * auVar7._8_4_);
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar128._12_4_ = (float)((uint)bVar19 * auVar101._12_4_ | (uint)!bVar19 * auVar7._12_4_);
          fVar80 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar101._16_4_);
          auVar128._16_4_ = fVar80;
          fVar170 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar101._20_4_);
          auVar128._20_4_ = fVar170;
          fVar168 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar101._24_4_);
          auVar128._24_4_ = fVar168;
          iVar3 = (uint)(byte)(uVar72 >> 7) * auVar101._28_4_;
          auVar128._28_4_ = iVar3;
          auVar129._0_4_ =
               (uint)(bVar71 & 1) * (int)auVar12._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar100._0_4_;
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar129._4_4_ = (uint)bVar19 * (int)auVar12._4_4_ | (uint)!bVar19 * auVar100._4_4_;
          bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar129._8_4_ = (uint)bVar19 * (int)auVar12._8_4_ | (uint)!bVar19 * auVar100._8_4_;
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar129._12_4_ = (uint)bVar19 * (int)auVar12._12_4_ | (uint)!bVar19 * auVar100._12_4_;
          auVar129._16_4_ = (uint)!(bool)((byte)(uVar72 >> 4) & 1) * auVar100._16_4_;
          auVar129._20_4_ = (uint)!(bool)((byte)(uVar72 >> 5) & 1) * auVar100._20_4_;
          auVar129._24_4_ = (uint)!(bool)((byte)(uVar72 >> 6) & 1) * auVar100._24_4_;
          auVar129._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar100._28_4_;
          bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
          bVar22 = (bool)((byte)(uVar72 >> 2) & 1);
          bVar23 = (bool)((byte)(uVar72 >> 3) & 1);
          bVar20 = (bool)((byte)(uVar72 >> 1) & 1);
          bVar21 = (bool)((byte)(uVar72 >> 2) & 1);
          bVar24 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar100 = vsubps_avx512vl(auVar129,auVar93);
          auVar104 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar23 * (int)auVar85._12_4_ |
                                                   (uint)!bVar23 * auVar8._12_4_,
                                                   CONCAT48((uint)bVar22 * (int)auVar85._8_4_ |
                                                            (uint)!bVar22 * auVar8._8_4_,
                                                            CONCAT44((uint)bVar19 *
                                                                     (int)auVar85._4_4_ |
                                                                     (uint)!bVar19 * auVar8._4_4_,
                                                                     (uint)(bVar71 & 1) *
                                                                     (int)auVar85._0_4_ |
                                                                     (uint)!(bool)(bVar71 & 1) *
                                                                     auVar8._0_4_)))),auVar94);
          auVar103 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar24 * (int)auVar86._12_4_ |
                                                   (uint)!bVar24 * auVar9._12_4_,
                                                   CONCAT48((uint)bVar21 * (int)auVar86._8_4_ |
                                                            (uint)!bVar21 * auVar9._8_4_,
                                                            CONCAT44((uint)bVar20 *
                                                                     (int)auVar86._4_4_ |
                                                                     (uint)!bVar20 * auVar9._4_4_,
                                                                     (uint)(bVar71 & 1) *
                                                                     (int)auVar86._0_4_ |
                                                                     (uint)!(bool)(bVar71 & 1) *
                                                                     auVar9._0_4_)))),auVar125);
          auVar102 = vsubps_avx(auVar93,auVar126);
          auVar98 = vsubps_avx(auVar94,auVar127);
          auVar99 = vsubps_avx(auVar125,auVar128);
          auVar62._4_4_ = auVar103._4_4_ * fVar132;
          auVar62._0_4_ = auVar103._0_4_ * fVar81;
          auVar62._8_4_ = auVar103._8_4_ * fVar134;
          auVar62._12_4_ = auVar103._12_4_ * fVar136;
          auVar62._16_4_ = auVar103._16_4_ * 0.0;
          auVar62._20_4_ = auVar103._20_4_ * 0.0;
          auVar62._24_4_ = auVar103._24_4_ * 0.0;
          auVar62._28_4_ = 0;
          auVar83 = vfmsub231ps_fma(auVar62,auVar125,auVar100);
          auVar157._0_4_ = fVar131 * auVar100._0_4_;
          auVar157._4_4_ = fVar133 * auVar100._4_4_;
          auVar157._8_4_ = fVar135 * auVar100._8_4_;
          auVar157._12_4_ = fVar137 * auVar100._12_4_;
          auVar157._16_4_ = auVar100._16_4_ * 0.0;
          auVar157._20_4_ = auVar100._20_4_ * 0.0;
          auVar157._24_4_ = auVar100._24_4_ * 0.0;
          auVar157._28_4_ = 0;
          auVar84 = vfmsub231ps_fma(auVar157,auVar93,auVar104);
          auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar88,ZEXT1632(auVar83));
          auVar161._0_4_ = auVar104._0_4_ * auVar125._0_4_;
          auVar161._4_4_ = auVar104._4_4_ * auVar125._4_4_;
          auVar161._8_4_ = auVar104._8_4_ * auVar125._8_4_;
          auVar161._12_4_ = auVar104._12_4_ * auVar125._12_4_;
          auVar161._16_4_ = auVar104._16_4_ * fVar173;
          auVar161._20_4_ = auVar104._20_4_ * fVar151;
          auVar161._24_4_ = auVar104._24_4_ * fVar142;
          auVar161._28_4_ = 0;
          auVar83 = vfmsub231ps_fma(auVar161,auVar94,auVar103);
          auVar105 = vfmadd231ps_avx512vl(auVar101,auVar88,ZEXT1632(auVar83));
          auVar101 = vmulps_avx512vl(auVar99,auVar126);
          auVar101 = vfmsub231ps_avx512vl(auVar101,auVar102,auVar128);
          auVar63._4_4_ = auVar98._4_4_ * auVar128._4_4_;
          auVar63._0_4_ = auVar98._0_4_ * auVar128._0_4_;
          auVar63._8_4_ = auVar98._8_4_ * auVar128._8_4_;
          auVar63._12_4_ = auVar98._12_4_ * auVar128._12_4_;
          auVar63._16_4_ = auVar98._16_4_ * fVar80;
          auVar63._20_4_ = auVar98._20_4_ * fVar170;
          auVar63._24_4_ = auVar98._24_4_ * fVar168;
          auVar63._28_4_ = iVar3;
          auVar83 = vfmsub231ps_fma(auVar63,auVar127,auVar99);
          auVar162._0_4_ = auVar127._0_4_ * auVar102._0_4_;
          auVar162._4_4_ = auVar127._4_4_ * auVar102._4_4_;
          auVar162._8_4_ = auVar127._8_4_ * auVar102._8_4_;
          auVar162._12_4_ = auVar127._12_4_ * auVar102._12_4_;
          auVar162._16_4_ = fVar169 * auVar102._16_4_;
          auVar162._20_4_ = fVar175 * auVar102._20_4_;
          auVar162._24_4_ = fVar171 * auVar102._24_4_;
          auVar162._28_4_ = 0;
          auVar84 = vfmsub231ps_fma(auVar162,auVar98,auVar126);
          auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar88,auVar101);
          auVar106 = vfmadd231ps_avx512vl(auVar101,auVar88,ZEXT1632(auVar83));
          auVar101 = vmaxps_avx(auVar105,auVar106);
          uVar143 = vcmpps_avx512vl(auVar101,auVar88,2);
          bVar79 = bVar79 & (byte)uVar143;
          auVar187 = ZEXT3264(auVar92);
          if (bVar79 != 0) {
            auVar64._4_4_ = auVar99._4_4_ * auVar104._4_4_;
            auVar64._0_4_ = auVar99._0_4_ * auVar104._0_4_;
            auVar64._8_4_ = auVar99._8_4_ * auVar104._8_4_;
            auVar64._12_4_ = auVar99._12_4_ * auVar104._12_4_;
            auVar64._16_4_ = auVar99._16_4_ * auVar104._16_4_;
            auVar64._20_4_ = auVar99._20_4_ * auVar104._20_4_;
            auVar64._24_4_ = auVar99._24_4_ * auVar104._24_4_;
            auVar64._28_4_ = auVar101._28_4_;
            auVar7 = vfmsub231ps_fma(auVar64,auVar98,auVar103);
            auVar65._4_4_ = auVar103._4_4_ * auVar102._4_4_;
            auVar65._0_4_ = auVar103._0_4_ * auVar102._0_4_;
            auVar65._8_4_ = auVar103._8_4_ * auVar102._8_4_;
            auVar65._12_4_ = auVar103._12_4_ * auVar102._12_4_;
            auVar65._16_4_ = auVar103._16_4_ * auVar102._16_4_;
            auVar65._20_4_ = auVar103._20_4_ * auVar102._20_4_;
            auVar65._24_4_ = auVar103._24_4_ * auVar102._24_4_;
            auVar65._28_4_ = auVar103._28_4_;
            auVar84 = vfmsub231ps_fma(auVar65,auVar100,auVar99);
            auVar66._4_4_ = auVar98._4_4_ * auVar100._4_4_;
            auVar66._0_4_ = auVar98._0_4_ * auVar100._0_4_;
            auVar66._8_4_ = auVar98._8_4_ * auVar100._8_4_;
            auVar66._12_4_ = auVar98._12_4_ * auVar100._12_4_;
            auVar66._16_4_ = auVar98._16_4_ * auVar100._16_4_;
            auVar66._20_4_ = auVar98._20_4_ * auVar100._20_4_;
            auVar66._24_4_ = auVar98._24_4_ * auVar100._24_4_;
            auVar66._28_4_ = auVar98._28_4_;
            auVar8 = vfmsub231ps_fma(auVar66,auVar102,auVar104);
            auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar84),ZEXT1632(auVar8));
            auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar7),auVar88);
            auVar104 = vrcp14ps_avx512vl(auVar101);
            auVar102 = auVar195._0_32_;
            auVar103 = vfnmadd213ps_avx512vl(auVar104,auVar101,auVar102);
            auVar83 = vfmadd132ps_fma(auVar103,auVar104,auVar104);
            auVar67._4_4_ = auVar8._4_4_ * auVar125._4_4_;
            auVar67._0_4_ = auVar8._0_4_ * auVar125._0_4_;
            auVar67._8_4_ = auVar8._8_4_ * auVar125._8_4_;
            auVar67._12_4_ = auVar8._12_4_ * auVar125._12_4_;
            auVar67._16_4_ = fVar173 * 0.0;
            auVar67._20_4_ = fVar151 * 0.0;
            auVar67._24_4_ = fVar142 * 0.0;
            auVar67._28_4_ = iVar2;
            auVar84 = vfmadd231ps_fma(auVar67,auVar94,ZEXT1632(auVar84));
            auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar93,ZEXT1632(auVar7));
            fVar142 = auVar83._0_4_;
            fVar151 = auVar83._4_4_;
            fVar173 = auVar83._8_4_;
            fVar175 = auVar83._12_4_;
            local_3a0 = ZEXT1632(CONCAT412(auVar84._12_4_ * fVar175,
                                           CONCAT48(auVar84._8_4_ * fVar173,
                                                    CONCAT44(auVar84._4_4_ * fVar151,
                                                             auVar84._0_4_ * fVar142))));
            auVar69._4_4_ = uStack_43c;
            auVar69._0_4_ = local_440;
            auVar69._8_4_ = uStack_438;
            auVar69._12_4_ = uStack_434;
            auVar69._16_4_ = uStack_430;
            auVar69._20_4_ = uStack_42c;
            auVar69._24_4_ = uStack_428;
            auVar69._28_4_ = uStack_424;
            uVar143 = vcmpps_avx512vl(local_3a0,auVar69,0xd);
            uVar138 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar32._4_4_ = uVar138;
            auVar32._0_4_ = uVar138;
            auVar32._8_4_ = uVar138;
            auVar32._12_4_ = uVar138;
            auVar32._16_4_ = uVar138;
            auVar32._20_4_ = uVar138;
            auVar32._24_4_ = uVar138;
            auVar32._28_4_ = uVar138;
            uVar27 = vcmpps_avx512vl(local_3a0,auVar32,2);
            bVar79 = (byte)uVar143 & (byte)uVar27 & bVar79;
            if (bVar79 != 0) {
              uVar143 = vcmpps_avx512vl(auVar101,auVar88,4);
              bVar79 = bVar79 & (byte)uVar143;
              auVar186 = ZEXT3264(local_660);
              if (bVar79 != 0) {
                fVar169 = auVar105._0_4_ * fVar142;
                fVar171 = auVar105._4_4_ * fVar151;
                auVar68._4_4_ = fVar171;
                auVar68._0_4_ = fVar169;
                fVar168 = auVar105._8_4_ * fVar173;
                auVar68._8_4_ = fVar168;
                fVar170 = auVar105._12_4_ * fVar175;
                auVar68._12_4_ = fVar170;
                fVar80 = auVar105._16_4_ * 0.0;
                auVar68._16_4_ = fVar80;
                fVar81 = auVar105._20_4_ * 0.0;
                auVar68._20_4_ = fVar81;
                fVar131 = auVar105._24_4_ * 0.0;
                auVar68._24_4_ = fVar131;
                auVar68._28_4_ = auVar101._28_4_;
                auVar104 = vsubps_avx512vl(auVar102,auVar68);
                local_3e0._0_4_ =
                     (float)((uint)(bVar71 & 1) * (int)fVar169 |
                            (uint)!(bool)(bVar71 & 1) * auVar104._0_4_);
                bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
                local_3e0._4_4_ =
                     (float)((uint)bVar19 * (int)fVar171 | (uint)!bVar19 * auVar104._4_4_);
                bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
                local_3e0._8_4_ =
                     (float)((uint)bVar19 * (int)fVar168 | (uint)!bVar19 * auVar104._8_4_);
                bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
                local_3e0._12_4_ =
                     (float)((uint)bVar19 * (int)fVar170 | (uint)!bVar19 * auVar104._12_4_);
                bVar19 = (bool)((byte)(uVar72 >> 4) & 1);
                local_3e0._16_4_ =
                     (float)((uint)bVar19 * (int)fVar80 | (uint)!bVar19 * auVar104._16_4_);
                bVar19 = (bool)((byte)(uVar72 >> 5) & 1);
                local_3e0._20_4_ =
                     (float)((uint)bVar19 * (int)fVar81 | (uint)!bVar19 * auVar104._20_4_);
                bVar19 = (bool)((byte)(uVar72 >> 6) & 1);
                local_3e0._24_4_ =
                     (float)((uint)bVar19 * (int)fVar131 | (uint)!bVar19 * auVar104._24_4_);
                bVar19 = SUB81(uVar72 >> 7,0);
                local_3e0._28_4_ =
                     (float)((uint)bVar19 * auVar101._28_4_ | (uint)!bVar19 * auVar104._28_4_);
                auVar101 = vsubps_avx(ZEXT1632(auVar82),auVar107);
                auVar83 = vfmadd213ps_fma(auVar101,local_3e0,auVar107);
                uVar138 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                auVar33._4_4_ = uVar138;
                auVar33._0_4_ = uVar138;
                auVar33._8_4_ = uVar138;
                auVar33._12_4_ = uVar138;
                auVar33._16_4_ = uVar138;
                auVar33._20_4_ = uVar138;
                auVar33._24_4_ = uVar138;
                auVar33._28_4_ = uVar138;
                auVar101 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                              CONCAT48(auVar83._8_4_ + auVar83._8_4_
                                                                       ,CONCAT44(auVar83._4_4_ +
                                                                                 auVar83._4_4_,
                                                                                 auVar83._0_4_ +
                                                                                 auVar83._0_4_)))),
                                           auVar33);
                uVar143 = vcmpps_avx512vl(local_3a0,auVar101,6);
                if (((byte)uVar143 & bVar79) != 0) {
                  auVar147._0_4_ = auVar106._0_4_ * fVar142;
                  auVar147._4_4_ = auVar106._4_4_ * fVar151;
                  auVar147._8_4_ = auVar106._8_4_ * fVar173;
                  auVar147._12_4_ = auVar106._12_4_ * fVar175;
                  auVar147._16_4_ = auVar106._16_4_ * 0.0;
                  auVar147._20_4_ = auVar106._20_4_ * 0.0;
                  auVar147._24_4_ = auVar106._24_4_ * 0.0;
                  auVar147._28_4_ = 0;
                  auVar101 = vsubps_avx512vl(auVar102,auVar147);
                  auVar130._0_4_ =
                       (uint)(bVar71 & 1) * (int)auVar147._0_4_ |
                       (uint)!(bool)(bVar71 & 1) * auVar101._0_4_;
                  bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
                  auVar130._4_4_ =
                       (uint)bVar19 * (int)auVar147._4_4_ | (uint)!bVar19 * auVar101._4_4_;
                  bVar19 = (bool)((byte)(uVar72 >> 2) & 1);
                  auVar130._8_4_ =
                       (uint)bVar19 * (int)auVar147._8_4_ | (uint)!bVar19 * auVar101._8_4_;
                  bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
                  auVar130._12_4_ =
                       (uint)bVar19 * (int)auVar147._12_4_ | (uint)!bVar19 * auVar101._12_4_;
                  bVar19 = (bool)((byte)(uVar72 >> 4) & 1);
                  auVar130._16_4_ =
                       (uint)bVar19 * (int)auVar147._16_4_ | (uint)!bVar19 * auVar101._16_4_;
                  bVar19 = (bool)((byte)(uVar72 >> 5) & 1);
                  auVar130._20_4_ =
                       (uint)bVar19 * (int)auVar147._20_4_ | (uint)!bVar19 * auVar101._20_4_;
                  bVar19 = (bool)((byte)(uVar72 >> 6) & 1);
                  auVar130._24_4_ =
                       (uint)bVar19 * (int)auVar147._24_4_ | (uint)!bVar19 * auVar101._24_4_;
                  auVar130._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar101._28_4_;
                  auVar34._8_4_ = 0x40000000;
                  auVar34._0_8_ = 0x4000000040000000;
                  auVar34._12_4_ = 0x40000000;
                  auVar34._16_4_ = 0x40000000;
                  auVar34._20_4_ = 0x40000000;
                  auVar34._24_4_ = 0x40000000;
                  auVar34._28_4_ = 0x40000000;
                  local_3c0 = vfmsub132ps_avx512vl(auVar130,auVar102,auVar34);
                  local_380 = (undefined4)lVar74;
                  local_370 = local_610._0_8_;
                  uStack_368 = local_610._8_8_;
                  local_360 = local_620._0_8_;
                  uStack_358 = local_620._8_8_;
                  local_350 = local_630._0_8_;
                  uStack_348 = local_630._8_8_;
                  pGVar15 = (context->scene->geometries).items[uVar13].ptr;
                  if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                    bVar71 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar71 = 1, pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar83 = vcvtsi2ss_avx512f(auVar188._0_16_,local_380);
                    fVar142 = auVar83._0_4_;
                    local_320[0] = (fVar142 + local_3e0._0_4_ + 0.0) * local_460;
                    local_320[1] = (fVar142 + local_3e0._4_4_ + 1.0) * fStack_45c;
                    local_320[2] = (fVar142 + local_3e0._8_4_ + 2.0) * fStack_458;
                    local_320[3] = (fVar142 + local_3e0._12_4_ + 3.0) * fStack_454;
                    fStack_310 = (fVar142 + local_3e0._16_4_ + 4.0) * fStack_450;
                    fStack_30c = (fVar142 + local_3e0._20_4_ + 5.0) * fStack_44c;
                    fStack_308 = (fVar142 + local_3e0._24_4_ + 6.0) * fStack_448;
                    fStack_304 = fVar142 + local_3e0._28_4_ + 7.0;
                    local_300 = local_3c0;
                    local_2e0 = local_3a0;
                    uVar72 = 0;
                    uVar77 = (ulong)((byte)uVar143 & bVar79);
                    for (uVar28 = uVar77; local_37c = iVar14, (uVar28 & 1) == 0;
                        uVar28 = uVar28 >> 1 | 0x8000000000000000) {
                      uVar72 = uVar72 + 1;
                    }
                    while (auVar83 = auVar188._0_16_, uVar77 != 0) {
                      uVar138 = *(undefined4 *)(ray + k * 4 + 0x100);
                      fVar142 = local_320[uVar72];
                      auVar146._4_4_ = fVar142;
                      auVar146._0_4_ = fVar142;
                      auVar146._8_4_ = fVar142;
                      auVar146._12_4_ = fVar142;
                      local_220._16_4_ = fVar142;
                      local_220._0_16_ = auVar146;
                      local_220._20_4_ = fVar142;
                      local_220._24_4_ = fVar142;
                      local_220._28_4_ = fVar142;
                      local_200 = *(undefined4 *)(local_300 + uVar72 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar72 * 4)
                      ;
                      local_690.context = context->user;
                      fVar151 = 1.0 - fVar142;
                      auVar7 = vfnmadd231ss_fma(ZEXT416((uint)(fVar142 * (fVar151 + fVar151))),
                                                ZEXT416((uint)fVar151),ZEXT416((uint)fVar151));
                      auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar146,
                                                ZEXT416(0xc0a00000));
                      auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142 * 3.0)),
                                                ZEXT416((uint)(fVar142 + fVar142)),auVar83);
                      auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar146,
                                                ZEXT416(0x40000000));
                      auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151 * -3.0)),
                                                ZEXT416((uint)(fVar151 + fVar151)),auVar83);
                      auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142)),auVar146,
                                                ZEXT416((uint)(fVar151 * -2.0)));
                      fVar142 = auVar7._0_4_ * 0.5;
                      fVar151 = auVar82._0_4_ * 0.5;
                      fVar173 = auVar83._0_4_ * 0.5;
                      fVar175 = auVar84._0_4_ * 0.5;
                      auVar154._0_4_ = fVar175 * (float)local_490._0_4_;
                      auVar154._4_4_ = fVar175 * (float)local_490._4_4_;
                      auVar154._8_4_ = fVar175 * fStack_488;
                      auVar154._12_4_ = fVar175 * fStack_484;
                      auVar165._4_4_ = fVar173;
                      auVar165._0_4_ = fVar173;
                      auVar165._8_4_ = fVar173;
                      auVar165._12_4_ = fVar173;
                      auVar83 = vfmadd132ps_fma(auVar165,auVar154,local_630);
                      auVar155._4_4_ = fVar151;
                      auVar155._0_4_ = fVar151;
                      auVar155._8_4_ = fVar151;
                      auVar155._12_4_ = fVar151;
                      auVar83 = vfmadd132ps_fma(auVar155,auVar83,local_620);
                      auVar141._4_4_ = fVar142;
                      auVar141._0_4_ = fVar142;
                      auVar141._8_4_ = fVar142;
                      auVar141._12_4_ = fVar142;
                      auVar83 = vfmadd132ps_fma(auVar141,auVar83,local_610);
                      local_280 = auVar83._0_4_;
                      auVar163._8_4_ = 1;
                      auVar163._0_8_ = 0x100000001;
                      auVar163._12_4_ = 1;
                      auVar163._16_4_ = 1;
                      auVar163._20_4_ = 1;
                      auVar163._24_4_ = 1;
                      auVar163._28_4_ = 1;
                      local_260 = vpermps_avx2(auVar163,ZEXT1632(auVar83));
                      auVar167._8_4_ = 2;
                      auVar167._0_8_ = 0x200000002;
                      auVar167._12_4_ = 2;
                      auVar167._16_4_ = 2;
                      auVar167._20_4_ = 2;
                      auVar167._24_4_ = 2;
                      auVar167._28_4_ = 2;
                      local_240 = vpermps_avx2(auVar167,ZEXT1632(auVar83));
                      uStack_27c = local_280;
                      uStack_278 = local_280;
                      uStack_274 = local_280;
                      uStack_270 = local_280;
                      uStack_26c = local_280;
                      uStack_268 = local_280;
                      uStack_264 = local_280;
                      uStack_1fc = local_200;
                      uStack_1f8 = local_200;
                      uStack_1f4 = local_200;
                      uStack_1f0 = local_200;
                      uStack_1ec = local_200;
                      uStack_1e8 = local_200;
                      uStack_1e4 = local_200;
                      local_1e0 = local_2a0._0_8_;
                      uStack_1d8 = local_2a0._8_8_;
                      uStack_1d0 = local_2a0._16_8_;
                      uStack_1c8 = local_2a0._24_8_;
                      local_1c0 = local_400;
                      vpcmpeqd_avx2(local_400,local_400);
                      local_1a0 = (local_690.context)->instID[0];
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = (local_690.context)->instPrimID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_580 = local_2c0;
                      local_690.valid = (int *)local_580;
                      local_690.geometryUserPtr = pGVar15->userPtr;
                      local_690.hit = (RTCHitN *)&local_280;
                      local_690.N = 8;
                      local_480._0_8_ = uVar77;
                      local_690.ray = (RTCRayN *)ray;
                      if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar15->occlusionFilterN)(&local_690);
                        uVar77 = local_480._0_8_;
                      }
                      if (local_580 != (undefined1  [32])0x0) {
                        p_Var18 = context->args->filter;
                        if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var18)(&local_690);
                          uVar77 = local_480._0_8_;
                        }
                        auVar83 = auVar188._0_16_;
                        uVar28 = vptestmd_avx512vl(local_580,local_580);
                        auVar101 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar19 = (bool)((byte)uVar28 & 1);
                        bVar20 = (bool)((byte)(uVar28 >> 1) & 1);
                        bVar22 = (bool)((byte)(uVar28 >> 2) & 1);
                        bVar21 = (bool)((byte)(uVar28 >> 3) & 1);
                        bVar23 = (bool)((byte)(uVar28 >> 4) & 1);
                        bVar24 = (bool)((byte)(uVar28 >> 5) & 1);
                        bVar25 = (bool)((byte)(uVar28 >> 6) & 1);
                        bVar26 = SUB81(uVar28 >> 7,0);
                        *(uint *)(local_690.ray + 0x100) =
                             (uint)bVar19 * auVar101._0_4_ |
                             (uint)!bVar19 * *(int *)(local_690.ray + 0x100);
                        *(uint *)(local_690.ray + 0x104) =
                             (uint)bVar20 * auVar101._4_4_ |
                             (uint)!bVar20 * *(int *)(local_690.ray + 0x104);
                        *(uint *)(local_690.ray + 0x108) =
                             (uint)bVar22 * auVar101._8_4_ |
                             (uint)!bVar22 * *(int *)(local_690.ray + 0x108);
                        *(uint *)(local_690.ray + 0x10c) =
                             (uint)bVar21 * auVar101._12_4_ |
                             (uint)!bVar21 * *(int *)(local_690.ray + 0x10c);
                        *(uint *)(local_690.ray + 0x110) =
                             (uint)bVar23 * auVar101._16_4_ |
                             (uint)!bVar23 * *(int *)(local_690.ray + 0x110);
                        *(uint *)(local_690.ray + 0x114) =
                             (uint)bVar24 * auVar101._20_4_ |
                             (uint)!bVar24 * *(int *)(local_690.ray + 0x114);
                        *(uint *)(local_690.ray + 0x118) =
                             (uint)bVar25 * auVar101._24_4_ |
                             (uint)!bVar25 * *(int *)(local_690.ray + 0x118);
                        *(uint *)(local_690.ray + 0x11c) =
                             (uint)bVar26 * auVar101._28_4_ |
                             (uint)!bVar26 * *(int *)(local_690.ray + 0x11c);
                        if (local_580 != (undefined1  [32])0x0) {
                          bVar71 = 1;
                          goto LAB_01bb4a15;
                        }
                      }
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar138;
                      uVar28 = uVar72 & 0x3f;
                      uVar72 = 0;
                      uVar77 = uVar77 ^ 1L << uVar28;
                      for (uVar28 = uVar77; (uVar28 & 1) == 0;
                          uVar28 = uVar28 >> 1 | 0x8000000000000000) {
                        uVar72 = uVar72 + 1;
                      }
                    }
                    bVar71 = 0;
LAB_01bb4a15:
                    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar195 = ZEXT3264(auVar101);
                    auVar83 = vxorps_avx512vl(auVar83,auVar83);
                    auVar188 = ZEXT1664(auVar83);
                    auVar189 = ZEXT3264(local_4c0);
                    auVar190 = ZEXT3264(local_4e0);
                    auVar191 = ZEXT3264(local_500);
                    auVar187 = ZEXT3264(local_520);
                    auVar186 = ZEXT3264(local_660);
                    auVar192 = ZEXT3264(local_600);
                    auVar193 = ZEXT3264(local_5c0);
                    auVar194 = ZEXT3264(local_5e0);
                  }
                  bVar76 = (bool)(bVar76 | bVar71);
                }
              }
              goto LAB_01bb49fc;
            }
          }
          auVar186 = ZEXT3264(local_660);
        }
LAB_01bb49fc:
      }
    }
    if (bVar76) break;
    uVar138 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar31._4_4_ = uVar138;
    auVar31._0_4_ = uVar138;
    auVar31._8_4_ = uVar138;
    auVar31._12_4_ = uVar138;
    auVar31._16_4_ = uVar138;
    auVar31._20_4_ = uVar138;
    auVar31._24_4_ = uVar138;
    auVar31._28_4_ = uVar138;
    uVar143 = vcmpps_avx512vl(local_80,auVar31,2);
  }
  return uVar78 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }